

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersector1<8,_16777232,_true,_embree::avx2::SubGridMBIntersector1Pluecker<8,_true>_>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ushort uVar11;
  ushort uVar12;
  uint uVar13;
  Geometry *pGVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  RTCIntersectArguments *pRVar18;
  RTCRayQueryContext *pRVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  byte bVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  RayHit *pRVar53;
  uint uVar54;
  uint uVar55;
  undefined1 (*pauVar56) [16];
  AABBNodeMB4D *node1;
  ulong uVar57;
  undefined1 (*pauVar58) [16];
  long lVar59;
  long lVar60;
  uint uVar61;
  ulong uVar62;
  ulong uVar63;
  undefined1 (*pauVar64) [16];
  ulong uVar65;
  long lVar66;
  undefined1 (*pauVar67) [16];
  ulong uVar68;
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  long lVar72;
  long lVar73;
  ulong uVar74;
  long lVar75;
  ulong uVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  float fVar89;
  undefined1 auVar85 [32];
  float fVar87;
  float fVar88;
  undefined1 auVar86 [64];
  undefined4 uVar90;
  undefined1 auVar93 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  float fVar98;
  float fVar104;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar105;
  undefined1 auVar103 [32];
  undefined8 uVar106;
  undefined1 auVar107 [16];
  undefined1 auVar109 [32];
  undefined1 auVar108 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  __m128 a;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [64];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [64];
  float fVar142;
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [64];
  float fVar149;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [64];
  float fVar162;
  undefined1 auVar163 [32];
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  undefined1 auVar164 [64];
  float fVar171;
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  undefined1 auVar176 [64];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  float fVar188;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  undefined1 auVar189 [64];
  UVIdentity<8> mapUV;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vint8 bi;
  vbool<8> valid;
  vfloat<8> tNear;
  vfloat<8> dist;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2a01;
  undefined1 (*local_2a00) [16];
  ulong local_29f8;
  ulong local_29f0;
  ulong local_29e8;
  ulong local_29e0;
  ulong local_29d8;
  ulong local_29d0;
  RayQueryContext *local_29c8;
  uint local_29bc;
  uint local_29b8;
  int local_29b4;
  long local_29b0;
  ulong local_29a8;
  undefined1 local_29a0 [32];
  undefined1 local_2980 [32];
  long local_2960;
  long local_2958;
  RayHit *local_2950;
  ulong local_2948;
  long local_2940;
  long local_2938;
  Scene *local_2930;
  ulong local_2928;
  RTCFilterFunctionNArguments local_2920;
  float local_28f0;
  float local_28ec;
  float local_28e8;
  undefined4 local_28e4;
  undefined4 local_28e0;
  undefined4 local_28dc;
  uint local_28d8;
  uint local_28d4;
  uint local_28d0;
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2730 [16];
  float local_2720;
  float fStack_271c;
  float fStack_2718;
  float fStack_2714;
  float fStack_2710;
  float fStack_270c;
  float fStack_2708;
  float fStack_2704;
  undefined1 local_2700 [8];
  float fStack_26f8;
  float fStack_26f4;
  float fStack_26f0;
  float fStack_26ec;
  float fStack_26e8;
  float local_26e0;
  float fStack_26dc;
  float fStack_26d8;
  float fStack_26d4;
  float fStack_26d0;
  float fStack_26cc;
  float fStack_26c8;
  float fStack_26c4;
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [8];
  float fStack_2698;
  float fStack_2694;
  float fStack_2690;
  float fStack_268c;
  float fStack_2688;
  float fStack_2684;
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 *local_2640;
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  float local_25a0 [4];
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  undefined4 uStack_2584;
  float local_2580 [4];
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  undefined4 uStack_2564;
  float local_2560 [4];
  float fStack_2550;
  float fStack_254c;
  float fStack_2548;
  undefined4 uStack_2544;
  undefined1 local_2540 [8];
  float fStack_2538;
  float fStack_2534;
  float fStack_2530;
  float fStack_252c;
  float fStack_2528;
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  float local_2440;
  float fStack_243c;
  float fStack_2438;
  float fStack_2434;
  float fStack_2430;
  float fStack_242c;
  float fStack_2428;
  float fStack_2424;
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    pauVar56 = (undefined1 (*) [16])local_2390;
    uStack_2398 = 0;
    auVar20 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    aVar1 = (ray->super_RayK<1>).dir.field_0;
    fVar142 = (ray->super_RayK<1>).tfar;
    auVar86 = ZEXT464((uint)fVar142);
    auVar99._8_4_ = 0x7fffffff;
    auVar99._0_8_ = 0x7fffffff7fffffff;
    auVar99._12_4_ = 0x7fffffff;
    auVar99 = vandps_avx((undefined1  [16])aVar1,auVar99);
    auVar111._8_4_ = 0x219392ef;
    auVar111._0_8_ = 0x219392ef219392ef;
    auVar111._12_4_ = 0x219392ef;
    auVar99 = vcmpps_avx(auVar99,auVar111,1);
    auVar112._8_4_ = 0x3f800000;
    auVar112._0_8_ = 0x3f8000003f800000;
    auVar112._12_4_ = 0x3f800000;
    auVar111 = vdivps_avx(auVar112,(undefined1  [16])aVar1);
    auVar113._8_4_ = 0x5d5e0b6b;
    auVar113._0_8_ = 0x5d5e0b6b5d5e0b6b;
    auVar113._12_4_ = 0x5d5e0b6b;
    auVar99 = vblendvps_avx(auVar111,auVar113,auVar99);
    auVar111 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar142));
    auVar114._0_4_ = auVar99._0_4_ * 0.99999964;
    auVar114._4_4_ = auVar99._4_4_ * 0.99999964;
    auVar114._8_4_ = auVar99._8_4_ * 0.99999964;
    auVar114._12_4_ = auVar99._12_4_ * 0.99999964;
    uVar90 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_28a0._4_4_ = uVar90;
    local_28a0._0_4_ = uVar90;
    local_28a0._8_4_ = uVar90;
    local_28a0._12_4_ = uVar90;
    local_28a0._16_4_ = uVar90;
    local_28a0._20_4_ = uVar90;
    local_28a0._24_4_ = uVar90;
    local_28a0._28_4_ = uVar90;
    uVar90 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_28c0._4_4_ = uVar90;
    local_28c0._0_4_ = uVar90;
    local_28c0._8_4_ = uVar90;
    local_28c0._12_4_ = uVar90;
    local_28c0._16_4_ = uVar90;
    local_28c0._20_4_ = uVar90;
    local_28c0._24_4_ = uVar90;
    local_28c0._28_4_ = uVar90;
    auVar107._0_4_ = auVar99._0_4_ * 1.0000004;
    auVar107._4_4_ = auVar99._4_4_ * 1.0000004;
    auVar107._8_4_ = auVar99._8_4_ * 1.0000004;
    auVar107._12_4_ = auVar99._12_4_ * 1.0000004;
    auVar99 = vmovshdup_avx(auVar114);
    uVar106 = auVar99._0_8_;
    register0x000014c8 = uVar106;
    local_2700 = uVar106;
    register0x000014d0 = uVar106;
    register0x000014d8 = uVar106;
    auVar113 = vshufpd_avx(auVar114,auVar114,1);
    auVar112 = vshufps_avx(auVar114,auVar114,0xaa);
    uVar106 = auVar112._0_8_;
    local_2800._8_8_ = uVar106;
    local_2800._0_8_ = uVar106;
    local_2800._16_8_ = uVar106;
    local_2800._24_8_ = uVar106;
    auVar176 = ZEXT3264(local_2800);
    auVar112 = vmovshdup_avx(auVar107);
    uVar106 = auVar112._0_8_;
    local_2820._8_8_ = uVar106;
    local_2820._0_8_ = uVar106;
    local_2820._16_8_ = uVar106;
    local_2820._24_8_ = uVar106;
    auVar187 = ZEXT3264(local_2820);
    auVar112 = vshufps_avx(auVar107,auVar107,0xaa);
    uVar106 = auVar112._0_8_;
    local_2840._8_8_ = uVar106;
    local_2840._0_8_ = uVar106;
    local_2840._16_8_ = uVar106;
    local_2840._24_8_ = uVar106;
    auVar189 = ZEXT3264(local_2840);
    uVar68 = (ulong)(auVar114._0_4_ < 0.0) << 5;
    auVar129 = ZEXT3264(local_28a0);
    auVar148 = ZEXT3264(_local_2700);
    uVar70 = (ulong)(auVar99._0_4_ < 0.0) << 5 | 0x40;
    auVar134 = ZEXT3264(local_28c0);
    uVar71 = (ulong)(auVar113._0_4_ < 0.0) << 5 | 0x80;
    uVar65 = uVar68 ^ 0x20;
    uVar74 = uVar70 ^ 0x20;
    uVar76 = uVar71 ^ 0x20;
    uVar90 = auVar20._0_4_;
    local_2860._4_4_ = uVar90;
    local_2860._0_4_ = uVar90;
    local_2860._8_4_ = uVar90;
    local_2860._12_4_ = uVar90;
    local_2860._16_4_ = uVar90;
    local_2860._20_4_ = uVar90;
    local_2860._24_4_ = uVar90;
    local_2860._28_4_ = uVar90;
    auVar161 = ZEXT3264(local_2860);
    uVar90 = auVar111._0_4_;
    auVar164 = ZEXT3264(CONCAT428(uVar90,CONCAT424(uVar90,CONCAT420(uVar90,CONCAT416(uVar90,
                                                  CONCAT412(uVar90,CONCAT48(uVar90,CONCAT44(uVar90,
                                                  uVar90))))))));
    local_26c0._16_16_ = mm_lookupmask_ps._240_16_;
    local_26c0._0_16_ = mm_lookupmask_ps._240_16_;
    local_2520 = vperm2f128_avx(local_26c0,mm_lookupmask_ps._0_32_,2);
    auVar109._8_4_ = 0x3f800000;
    auVar109._0_8_ = 0x3f8000003f800000;
    auVar109._12_4_ = 0x3f800000;
    auVar109._16_4_ = 0x3f800000;
    auVar109._20_4_ = 0x3f800000;
    auVar109._24_4_ = 0x3f800000;
    auVar109._28_4_ = 0x3f800000;
    auVar119._8_4_ = 0xbf800000;
    auVar119._0_8_ = 0xbf800000bf800000;
    auVar119._12_4_ = 0xbf800000;
    auVar119._16_4_ = 0xbf800000;
    auVar119._20_4_ = 0xbf800000;
    auVar119._24_4_ = 0xbf800000;
    auVar119._28_4_ = 0xbf800000;
    _local_2540 = vblendvps_avx(auVar109,auVar119,local_2520);
    uVar90 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_2880._4_4_ = uVar90;
    local_2880._0_4_ = uVar90;
    local_2880._8_4_ = uVar90;
    local_2880._12_4_ = uVar90;
    local_2880._16_4_ = uVar90;
    local_2880._20_4_ = uVar90;
    local_2880._24_4_ = uVar90;
    local_2880._28_4_ = uVar90;
    auVar186 = ZEXT3264(local_2880);
    local_2950 = ray;
    local_26e0 = auVar114._0_4_;
    fStack_26dc = auVar114._0_4_;
    fStack_26d8 = auVar114._0_4_;
    fStack_26d4 = auVar114._0_4_;
    fStack_26d0 = auVar114._0_4_;
    fStack_26cc = auVar114._0_4_;
    fStack_26c8 = auVar114._0_4_;
    fStack_26c4 = auVar114._0_4_;
    local_2720 = auVar107._0_4_;
    fStack_271c = auVar107._0_4_;
    fStack_2718 = auVar107._0_4_;
    fStack_2714 = auVar107._0_4_;
    fStack_2710 = auVar107._0_4_;
    fStack_270c = auVar107._0_4_;
    fStack_2708 = auVar107._0_4_;
    fStack_2704 = auVar107._0_4_;
    fVar142 = auVar114._0_4_;
    fVar149 = auVar114._0_4_;
    fVar87 = auVar114._0_4_;
    fVar88 = auVar114._0_4_;
    fVar89 = auVar114._0_4_;
    fVar98 = auVar114._0_4_;
    fVar104 = auVar107._0_4_;
    fVar105 = auVar107._0_4_;
    fVar152 = auVar107._0_4_;
    fVar153 = auVar107._0_4_;
    fVar154 = auVar107._0_4_;
    fVar155 = auVar107._0_4_;
    local_29f8 = uVar76;
    local_29f0 = uVar74;
    local_29e8 = uVar65;
    local_29e0 = uVar71;
    local_29d8 = uVar70;
    local_29d0 = uVar68;
    local_29c8 = context;
    do {
      local_27c0 = auVar164._0_32_;
      while (pauVar58 = pauVar56 + -1, pauVar56 = pauVar56 + -1,
            *(float *)(*pauVar58 + 8) <= auVar86._0_4_) {
        uVar69 = *(ulong *)*pauVar56;
joined_r0x019baa11:
        if ((uVar69 & 8) != 0) {
          local_2960 = (ulong)((uint)uVar69 & 0xf) - 8;
          if (local_2960 != 0) {
            uVar69 = uVar69 & 0xfffffffffffffff0;
            local_2958 = 0;
            local_2948 = uVar69;
            local_2a00 = pauVar56;
            do {
              local_29b0 = local_2958 * 0xe0;
              uVar57 = *(ulong *)(uVar69 + 0x40 + local_29b0);
              auVar79._8_8_ = 0;
              auVar79._0_8_ = uVar57;
              auVar119 = vpmovzxbd_avx2(auVar79);
              uVar90 = *(undefined4 *)(uVar69 + 0x7c + local_29b0);
              auVar130._4_4_ = uVar90;
              auVar130._0_4_ = uVar90;
              auVar130._8_4_ = uVar90;
              auVar130._12_4_ = uVar90;
              auVar130._16_4_ = uVar90;
              auVar130._20_4_ = uVar90;
              auVar130._24_4_ = uVar90;
              auVar130._28_4_ = uVar90;
              uVar90 = *(undefined4 *)(uVar69 + 0x70 + local_29b0);
              auVar135._4_4_ = uVar90;
              auVar135._0_4_ = uVar90;
              auVar135._8_4_ = uVar90;
              auVar135._12_4_ = uVar90;
              auVar135._16_4_ = uVar90;
              auVar135._20_4_ = uVar90;
              auVar135._24_4_ = uVar90;
              auVar135._28_4_ = uVar90;
              auVar119 = vcvtdq2ps_avx(auVar119);
              auVar99 = vfmadd213ps_fma(auVar119,auVar130,auVar135);
              auVar20._8_8_ = 0;
              auVar20._0_8_ = *(ulong *)(uVar69 + 0x88 + local_29b0);
              auVar119 = vpmovzxbd_avx2(auVar20);
              uVar90 = *(undefined4 *)(uVar69 + 0xc4 + local_29b0);
              auVar143._4_4_ = uVar90;
              auVar143._0_4_ = uVar90;
              auVar143._8_4_ = uVar90;
              auVar143._12_4_ = uVar90;
              auVar143._16_4_ = uVar90;
              auVar143._20_4_ = uVar90;
              auVar143._24_4_ = uVar90;
              auVar143._28_4_ = uVar90;
              uVar90 = *(undefined4 *)(uVar69 + 0xb8 + local_29b0);
              auVar150._4_4_ = uVar90;
              auVar150._0_4_ = uVar90;
              auVar150._8_4_ = uVar90;
              auVar150._12_4_ = uVar90;
              auVar150._16_4_ = uVar90;
              auVar150._20_4_ = uVar90;
              auVar150._24_4_ = uVar90;
              auVar150._28_4_ = uVar90;
              auVar119 = vcvtdq2ps_avx(auVar119);
              auVar111 = vfmadd213ps_fma(auVar119,auVar143,auVar150);
              auVar92._8_8_ = 0;
              auVar92._0_8_ = *(ulong *)(uVar69 + 0x48 + local_29b0);
              auVar119 = vpmovzxbd_avx2(auVar92);
              auVar119 = vcvtdq2ps_avx(auVar119);
              auVar20 = vfmadd213ps_fma(auVar119,auVar130,auVar135);
              auVar2._8_8_ = 0;
              auVar2._0_8_ = *(ulong *)(uVar69 + 0x90 + local_29b0);
              auVar119 = vpmovzxbd_avx2(auVar2);
              auVar119 = vcvtdq2ps_avx(auVar119);
              auVar112 = vfmadd213ps_fma(auVar119,auVar143,auVar150);
              auVar3._8_8_ = 0;
              auVar3._0_8_ = *(ulong *)(uVar69 + 0x50 + local_29b0);
              auVar119 = vpmovzxbd_avx2(auVar3);
              auVar119 = vcvtdq2ps_avx(auVar119);
              uVar90 = *(undefined4 *)(uVar69 + 0x80 + local_29b0);
              auVar157._4_4_ = uVar90;
              auVar157._0_4_ = uVar90;
              auVar157._8_4_ = uVar90;
              auVar157._12_4_ = uVar90;
              auVar157._16_4_ = uVar90;
              auVar157._20_4_ = uVar90;
              auVar157._24_4_ = uVar90;
              auVar157._28_4_ = uVar90;
              uVar90 = *(undefined4 *)(uVar69 + 0x74 + local_29b0);
              auVar163._4_4_ = uVar90;
              auVar163._0_4_ = uVar90;
              auVar163._8_4_ = uVar90;
              auVar163._12_4_ = uVar90;
              auVar163._16_4_ = uVar90;
              auVar163._20_4_ = uVar90;
              auVar163._24_4_ = uVar90;
              auVar163._28_4_ = uVar90;
              auVar113 = vfmadd213ps_fma(auVar119,auVar157,auVar163);
              auVar4._8_8_ = 0;
              auVar4._0_8_ = *(ulong *)(uVar69 + 0x98 + local_29b0);
              auVar119 = vpmovzxbd_avx2(auVar4);
              auVar119 = vcvtdq2ps_avx(auVar119);
              uVar90 = *(undefined4 *)(uVar69 + 200 + local_29b0);
              auVar172._4_4_ = uVar90;
              auVar172._0_4_ = uVar90;
              auVar172._8_4_ = uVar90;
              auVar172._12_4_ = uVar90;
              auVar172._16_4_ = uVar90;
              auVar172._20_4_ = uVar90;
              auVar172._24_4_ = uVar90;
              auVar172._28_4_ = uVar90;
              uVar90 = *(undefined4 *)(uVar69 + 0xbc + local_29b0);
              auVar183._4_4_ = uVar90;
              auVar183._0_4_ = uVar90;
              auVar183._8_4_ = uVar90;
              auVar183._12_4_ = uVar90;
              auVar183._16_4_ = uVar90;
              auVar183._20_4_ = uVar90;
              auVar183._24_4_ = uVar90;
              auVar183._28_4_ = uVar90;
              auVar107 = vfmadd213ps_fma(auVar119,auVar172,auVar183);
              auVar5._8_8_ = 0;
              auVar5._0_8_ = *(ulong *)(uVar69 + 0x58 + local_29b0);
              auVar119 = vpmovzxbd_avx2(auVar5);
              auVar119 = vcvtdq2ps_avx(auVar119);
              auVar114 = vfmadd213ps_fma(auVar119,auVar157,auVar163);
              auVar6._8_8_ = 0;
              auVar6._0_8_ = *(ulong *)(uVar69 + 0xa0 + local_29b0);
              auVar119 = vpmovzxbd_avx2(auVar6);
              auVar119 = vcvtdq2ps_avx(auVar119);
              auVar2 = vfmadd213ps_fma(auVar119,auVar172,auVar183);
              auVar7._8_8_ = 0;
              auVar7._0_8_ = *(ulong *)(uVar69 + 0x60 + local_29b0);
              auVar119 = vpmovzxbd_avx2(auVar7);
              auVar119 = vcvtdq2ps_avx(auVar119);
              uVar90 = *(undefined4 *)(uVar69 + 0x84 + local_29b0);
              auVar173._4_4_ = uVar90;
              auVar173._0_4_ = uVar90;
              auVar173._8_4_ = uVar90;
              auVar173._12_4_ = uVar90;
              auVar173._16_4_ = uVar90;
              auVar173._20_4_ = uVar90;
              auVar173._24_4_ = uVar90;
              auVar173._28_4_ = uVar90;
              uVar90 = *(undefined4 *)(uVar69 + 0x78 + local_29b0);
              auVar184._4_4_ = uVar90;
              auVar184._0_4_ = uVar90;
              auVar184._8_4_ = uVar90;
              auVar184._12_4_ = uVar90;
              auVar184._16_4_ = uVar90;
              auVar184._20_4_ = uVar90;
              auVar184._24_4_ = uVar90;
              auVar184._28_4_ = uVar90;
              auVar3 = vfmadd213ps_fma(auVar119,auVar173,auVar184);
              auVar8._8_8_ = 0;
              auVar8._0_8_ = *(ulong *)(uVar69 + 0xa8 + local_29b0);
              auVar119 = vpmovzxbd_avx2(auVar8);
              auVar119 = vcvtdq2ps_avx(auVar119);
              auVar9._8_8_ = 0;
              auVar9._0_8_ = *(ulong *)(uVar69 + 0x68 + local_29b0);
              auVar109 = vpmovzxbd_avx2(auVar9);
              auVar109 = vcvtdq2ps_avx(auVar109);
              auVar4 = vfmadd213ps_fma(auVar109,auVar173,auVar184);
              uVar90 = *(undefined4 *)(uVar69 + 0xcc + local_29b0);
              auVar174._4_4_ = uVar90;
              auVar174._0_4_ = uVar90;
              auVar174._8_4_ = uVar90;
              auVar174._12_4_ = uVar90;
              auVar174._16_4_ = uVar90;
              auVar174._20_4_ = uVar90;
              auVar174._24_4_ = uVar90;
              auVar174._28_4_ = uVar90;
              uVar90 = *(undefined4 *)(uVar69 + 0xc0 + local_29b0);
              auVar185._4_4_ = uVar90;
              auVar185._0_4_ = uVar90;
              auVar185._8_4_ = uVar90;
              auVar185._12_4_ = uVar90;
              auVar185._16_4_ = uVar90;
              auVar185._20_4_ = uVar90;
              auVar185._24_4_ = uVar90;
              auVar185._28_4_ = uVar90;
              auVar5 = vfmadd213ps_fma(auVar119,auVar174,auVar185);
              auVar10._8_8_ = 0;
              auVar10._0_8_ = *(ulong *)(uVar69 + 0xb0 + local_29b0);
              auVar119 = vpmovzxbd_avx2(auVar10);
              auVar119 = vcvtdq2ps_avx(auVar119);
              auVar6 = vfmadd213ps_fma(auVar119,auVar174,auVar185);
              auVar186 = ZEXT3264(local_2880);
              fVar142 = ((ray->super_RayK<1>).dir.field_0.m128[3] -
                        *(float *)(uVar69 + 0xd0 + local_29b0)) *
                        *(float *)(uVar69 + 0xd4 + local_29b0);
              auVar175._4_4_ = fVar142;
              auVar175._0_4_ = fVar142;
              auVar175._8_4_ = fVar142;
              auVar175._12_4_ = fVar142;
              auVar175._16_4_ = fVar142;
              auVar175._20_4_ = fVar142;
              auVar175._24_4_ = fVar142;
              auVar175._28_4_ = fVar142;
              auVar119 = vsubps_avx(ZEXT1632(auVar111),ZEXT1632(auVar99));
              auVar7 = vfmadd213ps_fma(auVar119,auVar175,ZEXT1632(auVar99));
              auVar119 = vsubps_avx(ZEXT1632(auVar112),ZEXT1632(auVar20));
              auVar20 = vfmadd213ps_fma(auVar119,auVar175,ZEXT1632(auVar20));
              auVar119 = vsubps_avx(ZEXT1632(auVar107),ZEXT1632(auVar113));
              auVar112 = vfmadd213ps_fma(auVar119,auVar175,ZEXT1632(auVar113));
              auVar119 = vsubps_avx(ZEXT1632(auVar2),ZEXT1632(auVar114));
              auVar161 = ZEXT3264(local_2860);
              auVar113 = vfmadd213ps_fma(auVar119,auVar175,ZEXT1632(auVar114));
              auVar119 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar3));
              auVar187 = ZEXT3264(local_2820);
              auVar107 = vfmadd213ps_fma(auVar119,auVar175,ZEXT1632(auVar3));
              auVar119 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar4));
              auVar114 = vfmadd213ps_fma(auVar119,auVar175,ZEXT1632(auVar4));
              auVar189 = ZEXT3264(local_2840);
              auVar176 = ZEXT3264(local_2800);
              auVar99 = vpminub_avx(auVar79,auVar92);
              auVar80._8_8_ = 0;
              auVar80._0_8_ = uVar57;
              auVar111 = vpcmpeqb_avx(auVar80,auVar99);
              auVar119 = vsubps_avx(ZEXT1632(auVar7),local_28a0);
              auVar25._4_4_ = auVar119._4_4_ * fStack_26dc;
              auVar25._0_4_ = auVar119._0_4_ * local_26e0;
              auVar25._8_4_ = auVar119._8_4_ * fStack_26d8;
              auVar25._12_4_ = auVar119._12_4_ * fStack_26d4;
              auVar25._16_4_ = auVar119._16_4_ * fStack_26d0;
              auVar25._20_4_ = auVar119._20_4_ * fStack_26cc;
              auVar25._24_4_ = auVar119._24_4_ * fStack_26c8;
              auVar25._28_4_ = auVar119._28_4_;
              auVar119 = vsubps_avx(ZEXT1632(auVar112),local_28c0);
              auVar24._4_4_ = auVar119._4_4_ * (float)local_2700._4_4_;
              auVar24._0_4_ = auVar119._0_4_ * (float)local_2700._0_4_;
              auVar24._8_4_ = auVar119._8_4_ * fStack_26f8;
              auVar24._12_4_ = auVar119._12_4_ * fStack_26f4;
              auVar24._16_4_ = auVar119._16_4_ * fStack_26f0;
              auVar24._20_4_ = auVar119._20_4_ * fStack_26ec;
              auVar24._24_4_ = auVar119._24_4_ * fStack_26e8;
              auVar24._28_4_ = auVar119._28_4_;
              auVar119 = vsubps_avx(ZEXT1632(auVar20),local_28a0);
              auVar21._4_4_ = auVar119._4_4_ * fStack_271c;
              auVar21._0_4_ = auVar119._0_4_ * local_2720;
              auVar21._8_4_ = auVar119._8_4_ * fStack_2718;
              auVar21._12_4_ = auVar119._12_4_ * fStack_2714;
              auVar21._16_4_ = auVar119._16_4_ * fStack_2710;
              auVar21._20_4_ = auVar119._20_4_ * fStack_270c;
              auVar21._24_4_ = auVar119._24_4_ * fStack_2708;
              auVar21._28_4_ = auVar119._28_4_;
              auVar119 = vsubps_avx(ZEXT1632(auVar113),local_28c0);
              auVar120._4_4_ = local_2820._4_4_ * auVar119._4_4_;
              auVar120._0_4_ = local_2820._0_4_ * auVar119._0_4_;
              auVar120._8_4_ = local_2820._8_4_ * auVar119._8_4_;
              auVar120._12_4_ = local_2820._12_4_ * auVar119._12_4_;
              auVar120._16_4_ = local_2820._16_4_ * auVar119._16_4_;
              auVar120._20_4_ = local_2820._20_4_ * auVar119._20_4_;
              auVar120._24_4_ = local_2820._24_4_ * auVar119._24_4_;
              auVar120._28_4_ = auVar119._28_4_;
              auVar119 = vpminsd_avx2(auVar25,auVar21);
              auVar109 = vpmaxsd_avx2(auVar25,auVar21);
              auVar25 = vpminsd_avx2(auVar24,auVar120);
              auVar25 = vpmaxsd_avx2(auVar119,auVar25);
              auVar24 = vpmaxsd_avx2(auVar24,auVar120);
              auVar119 = vsubps_avx(ZEXT1632(auVar107),local_2880);
              auVar22._4_4_ = local_2800._4_4_ * auVar119._4_4_;
              auVar22._0_4_ = local_2800._0_4_ * auVar119._0_4_;
              auVar22._8_4_ = local_2800._8_4_ * auVar119._8_4_;
              auVar22._12_4_ = local_2800._12_4_ * auVar119._12_4_;
              auVar22._16_4_ = local_2800._16_4_ * auVar119._16_4_;
              auVar22._20_4_ = local_2800._20_4_ * auVar119._20_4_;
              auVar22._24_4_ = local_2800._24_4_ * auVar119._24_4_;
              auVar22._28_4_ = auVar119._28_4_;
              auVar119 = vsubps_avx(ZEXT1632(auVar114),local_2880);
              auVar141._4_4_ = local_2840._4_4_ * auVar119._4_4_;
              auVar141._0_4_ = local_2840._0_4_ * auVar119._0_4_;
              auVar141._8_4_ = local_2840._8_4_ * auVar119._8_4_;
              auVar141._12_4_ = local_2840._12_4_ * auVar119._12_4_;
              auVar141._16_4_ = local_2840._16_4_ * auVar119._16_4_;
              auVar141._20_4_ = local_2840._20_4_ * auVar119._20_4_;
              auVar141._24_4_ = local_2840._24_4_ * auVar119._24_4_;
              auVar141._28_4_ = auVar119._28_4_;
              auVar24 = vpminsd_avx2(auVar109,auVar24);
              auVar109 = vpminsd_avx2(auVar22,auVar141);
              auVar119 = vpmaxsd_avx2(auVar22,auVar141);
              auVar109 = vpmaxsd_avx2(auVar109,local_2860);
              local_23c0 = vpmaxsd_avx2(auVar25,auVar109);
              auVar119 = vpminsd_avx2(auVar119,local_27c0);
              auVar119 = vpminsd_avx2(auVar24,auVar119);
              auVar119 = vpcmpgtd_avx2(local_23c0,auVar119);
              auVar99 = vpackssdw_avx(SUB3216(auVar119 ^ _DAT_01fe9960,0),
                                      SUB3216(auVar119 ^ _DAT_01fe9960,0x10));
              auVar111 = vpmovzxbw_avx(auVar111);
              auVar99 = vpand_avx(auVar99,auVar111);
              auVar99 = vpshufb_avx(auVar99,_DAT_01fed3c0);
              bVar23 = SUB161(auVar99 >> 7,0) & 1 | (SUB161(auVar99 >> 0xf,0) & 1) << 1 |
                       (SUB161(auVar99 >> 0x17,0) & 1) << 2 | (SUB161(auVar99 >> 0x1f,0) & 1) << 3 |
                       (SUB161(auVar99 >> 0x27,0) & 1) << 4 | (SUB161(auVar99 >> 0x2f,0) & 1) << 5 |
                       (SUB161(auVar99 >> 0x37,0) & 1) << 6 | SUB161(auVar99 >> 0x3f,0) << 7;
              if (bVar23 != 0) {
                local_29b0 = local_29b0 + uVar69;
                local_2928 = (ulong)bVar23;
                do {
                  pRVar53 = local_2950;
                  lVar59 = 0;
                  for (uVar57 = local_2928; (uVar57 & 1) == 0;
                      uVar57 = uVar57 >> 1 | 0x8000000000000000) {
                    lVar59 = lVar59 + 1;
                  }
                  fVar142 = (ray->super_RayK<1>).tfar;
                  if (*(float *)(local_23c0 + lVar59 * 4) <= fVar142) {
                    local_2730 = ZEXT416((uint)fVar142);
                    uVar11 = *(ushort *)(local_29b0 + lVar59 * 8);
                    uVar12 = *(ushort *)(local_29b0 + 2 + lVar59 * 8);
                    uVar61 = *(uint *)(local_29b0 + 0xd8);
                    uVar13 = *(uint *)(local_29b0 + 4 + lVar59 * 8);
                    local_2930 = context->scene;
                    pGVar14 = (local_2930->geometries).items[uVar61].ptr;
                    local_2938 = *(long *)&pGVar14->field_0x58;
                    local_29a8 = (ulong)uVar13;
                    local_2940 = pGVar14[1].super_RefCount.refCounter.
                                 super___atomic_base<unsigned_long>._M_i * (ulong)uVar13;
                    fVar149 = (pGVar14->time_range).lower;
                    fVar149 = pGVar14->fnumTimeSegments *
                              (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar149) /
                              ((pGVar14->time_range).upper - fVar149));
                    auVar99 = vroundss_avx(ZEXT416((uint)fVar149),ZEXT416((uint)fVar149),9);
                    auVar99 = vminss_avx(auVar99,ZEXT416((uint)(pGVar14->fnumTimeSegments + -1.0)));
                    auVar113 = vmaxss_avx(ZEXT816(0),auVar99);
                    local_29b8 = uVar11 & 0x7fff;
                    local_29bc = uVar12 & 0x7fff;
                    uVar54 = *(uint *)(local_2938 + 4 + local_2940);
                    uVar70 = (ulong)uVar54;
                    uVar68 = (ulong)(uVar54 * local_29bc +
                                    *(int *)(local_2938 + local_2940) + local_29b8);
                    lVar66 = *(long *)&pGVar14[2].numPrimitives;
                    lVar72 = (long)(int)auVar113._0_4_ * 0x38;
                    lVar15 = *(long *)(lVar66 + 0x10 + lVar72);
                    lVar16 = *(long *)(lVar66 + lVar72);
                    auVar99 = *(undefined1 (*) [16])(lVar16 + lVar15 * uVar68);
                    lVar17 = *(long *)(lVar66 + 0x48 + lVar72);
                    auVar111 = *(undefined1 (*) [16])(lVar16 + (uVar68 + 1) * lVar15);
                    lVar59 = uVar68 + uVar70;
                    auVar20 = *(undefined1 (*) [16])(lVar16 + lVar59 * lVar15);
                    lVar75 = uVar68 + uVar70 + 1;
                    auVar107 = *(undefined1 (*) [16])(lVar16 + lVar75 * lVar15);
                    lVar60 = uVar68 + (-1 < (short)uVar11) + 1;
                    auVar114 = *(undefined1 (*) [16])(lVar16 + lVar60 * lVar15);
                    lVar73 = (ulong)(-1 < (short)uVar11) + lVar75;
                    auVar112 = *(undefined1 (*) [16])(lVar16 + lVar73 * lVar15);
                    uVar65 = 0;
                    if (-1 < (short)uVar12) {
                      uVar65 = uVar70;
                    }
                    auVar2 = *(undefined1 (*) [16])(lVar16 + (lVar59 + uVar65) * lVar15);
                    auVar3 = *(undefined1 (*) [16])(lVar16 + (lVar75 + uVar65) * lVar15);
                    auVar4 = *(undefined1 (*) [16])(lVar16 + lVar15 * (uVar65 + lVar73));
                    lVar66 = *(long *)(lVar66 + 0x38 + lVar72);
                    fVar149 = fVar149 - auVar113._0_4_;
                    auVar81._4_4_ = fVar149;
                    auVar81._0_4_ = fVar149;
                    auVar81._8_4_ = fVar149;
                    auVar81._12_4_ = fVar149;
                    auVar113 = vsubps_avx(*(undefined1 (*) [16])(lVar66 + lVar17 * uVar68),auVar99);
                    auVar5 = vfmadd213ps_fma(auVar113,auVar81,auVar99);
                    auVar99 = vsubps_avx(*(undefined1 (*) [16])(lVar66 + lVar17 * (uVar68 + 1)),
                                         auVar111);
                    auVar6 = vfmadd213ps_fma(auVar99,auVar81,auVar111);
                    auVar99 = vsubps_avx(*(undefined1 (*) [16])(lVar66 + lVar17 * lVar59),auVar20);
                    auVar7 = vfmadd213ps_fma(auVar99,auVar81,auVar20);
                    auVar99 = vsubps_avx(*(undefined1 (*) [16])(lVar66 + lVar17 * lVar75),auVar107);
                    auVar8 = vfmadd213ps_fma(auVar99,auVar81,auVar107);
                    auVar99 = vsubps_avx(*(undefined1 (*) [16])(lVar66 + lVar17 * lVar60),auVar114);
                    auVar111 = vfmadd213ps_fma(auVar99,auVar81,auVar114);
                    auVar99 = vsubps_avx(*(undefined1 (*) [16])(lVar66 + lVar17 * lVar73),auVar112);
                    auVar9 = vfmadd213ps_fma(auVar99,auVar81,auVar112);
                    auVar99 = vsubps_avx(*(undefined1 (*) [16])(lVar66 + lVar17 * (lVar59 + uVar65))
                                         ,auVar2);
                    auVar2 = vfmadd213ps_fma(auVar99,auVar81,auVar2);
                    auVar99 = vsubps_avx(*(undefined1 (*) [16])(lVar66 + lVar17 * (lVar75 + uVar65))
                                         ,auVar3);
                    auVar3 = vfmadd213ps_fma(auVar99,auVar81,auVar3);
                    auVar99 = vsubps_avx(*(undefined1 (*) [16])(lVar66 + (uVar65 + lVar73) * lVar17)
                                         ,auVar4);
                    auVar4 = vfmadd213ps_fma(auVar99,auVar81,auVar4);
                    auVar20 = vunpcklps_avx(auVar6,auVar9);
                    auVar99 = vunpckhps_avx(auVar6,auVar9);
                    auVar112 = vunpcklps_avx(auVar111,auVar8);
                    auVar111 = vunpckhps_avx(auVar111,auVar8);
                    auVar113 = vunpcklps_avx(auVar99,auVar111);
                    auVar107 = vunpcklps_avx(auVar20,auVar112);
                    auVar99 = vunpckhps_avx(auVar20,auVar112);
                    auVar112 = vunpcklps_avx(auVar7,auVar3);
                    auVar111 = vunpckhps_avx(auVar7,auVar3);
                    auVar114 = vunpcklps_avx(auVar8,auVar2);
                    auVar20 = vunpckhps_avx(auVar8,auVar2);
                    auVar20 = vunpcklps_avx(auVar111,auVar20);
                    auVar2 = vunpcklps_avx(auVar112,auVar114);
                    auVar111 = vunpckhps_avx(auVar112,auVar114);
                    auVar136._16_16_ = auVar3;
                    auVar136._0_16_ = auVar7;
                    auVar101._16_16_ = auVar9;
                    auVar101._0_16_ = auVar6;
                    auVar119 = vunpcklps_avx(auVar101,auVar136);
                    auVar115._16_16_ = auVar4;
                    auVar115._0_16_ = auVar8;
                    auVar94._16_16_ = auVar8;
                    auVar94._0_16_ = auVar5;
                    auVar109 = vunpcklps_avx(auVar94,auVar115);
                    auVar24 = vunpcklps_avx(auVar109,auVar119);
                    auVar119 = vunpckhps_avx(auVar109,auVar119);
                    auVar109 = vunpckhps_avx(auVar101,auVar136);
                    auVar25 = vunpckhps_avx(auVar94,auVar115);
                    auVar109 = vunpcklps_avx(auVar25,auVar109);
                    auVar102._16_16_ = auVar107;
                    auVar102._0_16_ = auVar107;
                    auVar83._16_16_ = auVar99;
                    auVar83._0_16_ = auVar99;
                    auVar116._16_16_ = auVar113;
                    auVar116._0_16_ = auVar113;
                    auVar125._16_16_ = auVar2;
                    auVar125._0_16_ = auVar2;
                    auVar137._16_16_ = auVar111;
                    auVar137._0_16_ = auVar111;
                    uVar90 = *(undefined4 *)&(local_2950->super_RayK<1>).org.field_0;
                    auVar144._4_4_ = uVar90;
                    auVar144._0_4_ = uVar90;
                    auVar144._8_4_ = uVar90;
                    auVar144._12_4_ = uVar90;
                    auVar144._16_4_ = uVar90;
                    auVar144._20_4_ = uVar90;
                    auVar144._24_4_ = uVar90;
                    auVar144._28_4_ = uVar90;
                    uVar90 = *(undefined4 *)((long)&(local_2950->super_RayK<1>).org.field_0 + 4);
                    auVar151._4_4_ = uVar90;
                    auVar151._0_4_ = uVar90;
                    auVar151._8_4_ = uVar90;
                    auVar151._12_4_ = uVar90;
                    auVar151._16_4_ = uVar90;
                    auVar151._20_4_ = uVar90;
                    auVar151._24_4_ = uVar90;
                    auVar151._28_4_ = uVar90;
                    auVar131._16_16_ = auVar20;
                    auVar131._0_16_ = auVar20;
                    uVar90 = *(undefined4 *)((long)&(local_2950->super_RayK<1>).org.field_0 + 8);
                    auVar158._4_4_ = uVar90;
                    auVar158._0_4_ = uVar90;
                    auVar158._8_4_ = uVar90;
                    auVar158._12_4_ = uVar90;
                    auVar158._16_4_ = uVar90;
                    auVar158._20_4_ = uVar90;
                    auVar158._24_4_ = uVar90;
                    auVar158._28_4_ = uVar90;
                    local_2780 = vsubps_avx(auVar24,auVar144);
                    local_27a0 = vsubps_avx(auVar119,auVar151);
                    local_27e0 = vsubps_avx(auVar109,auVar158);
                    auVar119 = vsubps_avx(auVar102,auVar144);
                    auVar109 = vsubps_avx(auVar83,auVar151);
                    auVar25 = vsubps_avx(auVar116,auVar158);
                    auVar24 = vsubps_avx(auVar125,auVar144);
                    auVar21 = vsubps_avx(auVar137,auVar151);
                    auVar120 = vsubps_avx(auVar131,auVar158);
                    local_23e0 = vsubps_avx(auVar24,local_2780);
                    local_2420 = vsubps_avx(auVar21,local_27a0);
                    local_2400 = vsubps_avx(auVar120,local_27e0);
                    auVar84._0_4_ = auVar24._0_4_ + local_2780._0_4_;
                    auVar84._4_4_ = auVar24._4_4_ + local_2780._4_4_;
                    auVar84._8_4_ = auVar24._8_4_ + local_2780._8_4_;
                    auVar84._12_4_ = auVar24._12_4_ + local_2780._12_4_;
                    auVar84._16_4_ = auVar24._16_4_ + local_2780._16_4_;
                    auVar84._20_4_ = auVar24._20_4_ + local_2780._20_4_;
                    auVar84._24_4_ = auVar24._24_4_ + local_2780._24_4_;
                    auVar84._28_4_ = auVar24._28_4_ + local_2780._28_4_;
                    auVar110._0_4_ = auVar21._0_4_ + local_27a0._0_4_;
                    auVar110._4_4_ = auVar21._4_4_ + local_27a0._4_4_;
                    auVar110._8_4_ = auVar21._8_4_ + local_27a0._8_4_;
                    auVar110._12_4_ = auVar21._12_4_ + local_27a0._12_4_;
                    auVar110._16_4_ = auVar21._16_4_ + local_27a0._16_4_;
                    auVar110._20_4_ = auVar21._20_4_ + local_27a0._20_4_;
                    auVar110._24_4_ = auVar21._24_4_ + local_27a0._24_4_;
                    fVar152 = auVar21._28_4_;
                    auVar110._28_4_ = fVar152 + local_27a0._28_4_;
                    fVar171 = local_27e0._0_4_;
                    auVar132._0_4_ = fVar171 + auVar120._0_4_;
                    fVar177 = local_27e0._4_4_;
                    auVar132._4_4_ = fVar177 + auVar120._4_4_;
                    fVar178 = local_27e0._8_4_;
                    auVar132._8_4_ = fVar178 + auVar120._8_4_;
                    fVar179 = local_27e0._12_4_;
                    auVar132._12_4_ = fVar179 + auVar120._12_4_;
                    fVar180 = local_27e0._16_4_;
                    auVar132._16_4_ = fVar180 + auVar120._16_4_;
                    fVar181 = local_27e0._20_4_;
                    auVar132._20_4_ = fVar181 + auVar120._20_4_;
                    fVar182 = local_27e0._24_4_;
                    auVar132._24_4_ = fVar182 + auVar120._24_4_;
                    auVar132._28_4_ = local_27e0._28_4_ + auVar120._28_4_;
                    auVar32._4_4_ = local_2400._4_4_ * auVar110._4_4_;
                    auVar32._0_4_ = local_2400._0_4_ * auVar110._0_4_;
                    auVar32._8_4_ = local_2400._8_4_ * auVar110._8_4_;
                    auVar32._12_4_ = local_2400._12_4_ * auVar110._12_4_;
                    auVar32._16_4_ = local_2400._16_4_ * auVar110._16_4_;
                    auVar32._20_4_ = local_2400._20_4_ * auVar110._20_4_;
                    auVar32._24_4_ = local_2400._24_4_ * auVar110._24_4_;
                    auVar32._28_4_ = auVar111._12_4_;
                    auVar111 = vfmsub231ps_fma(auVar32,local_2420,auVar132);
                    auVar33._4_4_ = local_23e0._4_4_ * auVar132._4_4_;
                    auVar33._0_4_ = local_23e0._0_4_ * auVar132._0_4_;
                    auVar33._8_4_ = local_23e0._8_4_ * auVar132._8_4_;
                    auVar33._12_4_ = local_23e0._12_4_ * auVar132._12_4_;
                    auVar33._16_4_ = local_23e0._16_4_ * auVar132._16_4_;
                    auVar33._20_4_ = local_23e0._20_4_ * auVar132._20_4_;
                    auVar33._24_4_ = local_23e0._24_4_ * auVar132._24_4_;
                    auVar33._28_4_ = auVar132._28_4_;
                    auVar99 = vfmsub231ps_fma(auVar33,local_2400,auVar84);
                    auVar34._4_4_ = local_2420._4_4_ * auVar84._4_4_;
                    auVar34._0_4_ = local_2420._0_4_ * auVar84._0_4_;
                    auVar34._8_4_ = local_2420._8_4_ * auVar84._8_4_;
                    auVar34._12_4_ = local_2420._12_4_ * auVar84._12_4_;
                    auVar34._16_4_ = local_2420._16_4_ * auVar84._16_4_;
                    auVar34._20_4_ = local_2420._20_4_ * auVar84._20_4_;
                    auVar34._24_4_ = local_2420._24_4_ * auVar84._24_4_;
                    auVar34._28_4_ = auVar84._28_4_;
                    auVar20 = vfmsub231ps_fma(auVar34,local_23e0,auVar110);
                    uVar90 = *(undefined4 *)((long)&(local_2950->super_RayK<1>).dir.field_0 + 4);
                    local_2980._4_4_ = uVar90;
                    local_2980._0_4_ = uVar90;
                    local_2980._8_4_ = uVar90;
                    local_2980._12_4_ = uVar90;
                    local_2980._16_4_ = uVar90;
                    local_2980._20_4_ = uVar90;
                    local_2980._24_4_ = uVar90;
                    local_2980._28_4_ = uVar90;
                    local_2440 = (local_2950->super_RayK<1>).dir.field_0.m128[2];
                    auVar35._4_4_ = local_2440 * auVar20._4_4_;
                    auVar35._0_4_ = local_2440 * auVar20._0_4_;
                    auVar35._8_4_ = local_2440 * auVar20._8_4_;
                    auVar35._12_4_ = local_2440 * auVar20._12_4_;
                    auVar35._16_4_ = local_2440 * 0.0;
                    auVar35._20_4_ = local_2440 * 0.0;
                    auVar35._24_4_ = local_2440 * 0.0;
                    auVar35._28_4_ = local_2420._28_4_;
                    auVar99 = vfmadd231ps_fma(auVar35,local_2980,ZEXT1632(auVar99));
                    uVar90 = *(undefined4 *)&(local_2950->super_RayK<1>).dir.field_0;
                    local_29a0._4_4_ = uVar90;
                    local_29a0._0_4_ = uVar90;
                    local_29a0._8_4_ = uVar90;
                    local_29a0._12_4_ = uVar90;
                    local_29a0._16_4_ = uVar90;
                    local_29a0._20_4_ = uVar90;
                    local_29a0._24_4_ = uVar90;
                    local_29a0._28_4_ = uVar90;
                    auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),local_29a0,ZEXT1632(auVar111));
                    local_2460 = vsubps_avx(local_27a0,auVar109);
                    local_2480 = vsubps_avx(local_27e0,auVar25);
                    auVar133._0_4_ = local_27a0._0_4_ + auVar109._0_4_;
                    auVar133._4_4_ = local_27a0._4_4_ + auVar109._4_4_;
                    auVar133._8_4_ = local_27a0._8_4_ + auVar109._8_4_;
                    auVar133._12_4_ = local_27a0._12_4_ + auVar109._12_4_;
                    auVar133._16_4_ = local_27a0._16_4_ + auVar109._16_4_;
                    auVar133._20_4_ = local_27a0._20_4_ + auVar109._20_4_;
                    auVar133._24_4_ = local_27a0._24_4_ + auVar109._24_4_;
                    auVar133._28_4_ = local_27a0._28_4_ + auVar109._28_4_;
                    auVar138._0_4_ = fVar171 + auVar25._0_4_;
                    auVar138._4_4_ = fVar177 + auVar25._4_4_;
                    auVar138._8_4_ = fVar178 + auVar25._8_4_;
                    auVar138._12_4_ = fVar179 + auVar25._12_4_;
                    auVar138._16_4_ = fVar180 + auVar25._16_4_;
                    auVar138._20_4_ = fVar181 + auVar25._20_4_;
                    auVar138._24_4_ = fVar182 + auVar25._24_4_;
                    fVar149 = auVar25._28_4_;
                    auVar138._28_4_ = local_27e0._28_4_ + fVar149;
                    fVar87 = local_2480._0_4_;
                    fVar88 = local_2480._4_4_;
                    auVar36._4_4_ = auVar133._4_4_ * fVar88;
                    auVar36._0_4_ = auVar133._0_4_ * fVar87;
                    fVar89 = local_2480._8_4_;
                    auVar36._8_4_ = auVar133._8_4_ * fVar89;
                    fVar98 = local_2480._12_4_;
                    auVar36._12_4_ = auVar133._12_4_ * fVar98;
                    auVar114._0_4_ = local_2480._16_4_;
                    auVar36._16_4_ = auVar133._16_4_ * auVar114._0_4_;
                    fVar104 = local_2480._20_4_;
                    auVar36._20_4_ = auVar133._20_4_ * fVar104;
                    fVar105 = local_2480._24_4_;
                    auVar36._24_4_ = auVar133._24_4_ * fVar105;
                    auVar36._28_4_ = fVar149;
                    auVar20 = vfmsub231ps_fma(auVar36,local_2460,auVar138);
                    local_24a0 = vsubps_avx(local_2780,auVar119);
                    fVar188 = local_24a0._0_4_;
                    fVar190 = local_24a0._4_4_;
                    auVar37._4_4_ = fVar190 * auVar138._4_4_;
                    auVar37._0_4_ = fVar188 * auVar138._0_4_;
                    fVar191 = local_24a0._8_4_;
                    auVar37._8_4_ = fVar191 * auVar138._8_4_;
                    fVar192 = local_24a0._12_4_;
                    auVar37._12_4_ = fVar192 * auVar138._12_4_;
                    fVar193 = local_24a0._16_4_;
                    auVar37._16_4_ = fVar193 * auVar138._16_4_;
                    fVar194 = local_24a0._20_4_;
                    auVar37._20_4_ = fVar194 * auVar138._20_4_;
                    fVar195 = local_24a0._24_4_;
                    auVar37._24_4_ = fVar195 * auVar138._24_4_;
                    auVar37._28_4_ = local_2400._28_4_;
                    auVar139._0_4_ = auVar119._0_4_ + local_2780._0_4_;
                    auVar139._4_4_ = auVar119._4_4_ + local_2780._4_4_;
                    auVar139._8_4_ = auVar119._8_4_ + local_2780._8_4_;
                    auVar139._12_4_ = auVar119._12_4_ + local_2780._12_4_;
                    auVar139._16_4_ = auVar119._16_4_ + local_2780._16_4_;
                    auVar139._20_4_ = auVar119._20_4_ + local_2780._20_4_;
                    auVar139._24_4_ = auVar119._24_4_ + local_2780._24_4_;
                    auVar139._28_4_ = auVar119._28_4_ + local_2780._28_4_;
                    auVar111 = vfmsub231ps_fma(auVar37,local_2480,auVar139);
                    fVar162 = local_2460._0_4_;
                    fVar165 = local_2460._4_4_;
                    auVar38._4_4_ = fVar165 * auVar139._4_4_;
                    auVar38._0_4_ = fVar162 * auVar139._0_4_;
                    fVar166 = local_2460._8_4_;
                    auVar38._8_4_ = fVar166 * auVar139._8_4_;
                    fVar167 = local_2460._12_4_;
                    auVar38._12_4_ = fVar167 * auVar139._12_4_;
                    fVar168 = local_2460._16_4_;
                    auVar38._16_4_ = fVar168 * auVar139._16_4_;
                    fVar169 = local_2460._20_4_;
                    auVar38._20_4_ = fVar169 * auVar139._20_4_;
                    fVar170 = local_2460._24_4_;
                    auVar38._24_4_ = fVar170 * auVar139._24_4_;
                    auVar38._28_4_ = auVar139._28_4_;
                    auVar112 = vfmsub231ps_fma(auVar38,local_24a0,auVar133);
                    auVar140._0_4_ = local_2440 * auVar112._0_4_;
                    auVar140._4_4_ = local_2440 * auVar112._4_4_;
                    auVar140._8_4_ = local_2440 * auVar112._8_4_;
                    auVar140._12_4_ = local_2440 * auVar112._12_4_;
                    auVar140._16_4_ = local_2440 * 0.0;
                    auVar140._20_4_ = local_2440 * 0.0;
                    auVar140._24_4_ = local_2440 * 0.0;
                    auVar140._28_4_ = 0;
                    auVar111 = vfmadd231ps_fma(auVar140,local_2980,ZEXT1632(auVar111));
                    auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),local_29a0,ZEXT1632(auVar20));
                    auVar22 = vsubps_avx(auVar119,auVar24);
                    auVar126._0_4_ = auVar119._0_4_ + auVar24._0_4_;
                    auVar126._4_4_ = auVar119._4_4_ + auVar24._4_4_;
                    auVar126._8_4_ = auVar119._8_4_ + auVar24._8_4_;
                    auVar126._12_4_ = auVar119._12_4_ + auVar24._12_4_;
                    auVar126._16_4_ = auVar119._16_4_ + auVar24._16_4_;
                    auVar126._20_4_ = auVar119._20_4_ + auVar24._20_4_;
                    auVar126._24_4_ = auVar119._24_4_ + auVar24._24_4_;
                    auVar126._28_4_ = auVar119._28_4_ + auVar24._28_4_;
                    auVar24 = vsubps_avx(auVar109,auVar21);
                    auVar117._0_4_ = auVar21._0_4_ + auVar109._0_4_;
                    auVar117._4_4_ = auVar21._4_4_ + auVar109._4_4_;
                    auVar117._8_4_ = auVar21._8_4_ + auVar109._8_4_;
                    auVar117._12_4_ = auVar21._12_4_ + auVar109._12_4_;
                    auVar117._16_4_ = auVar21._16_4_ + auVar109._16_4_;
                    auVar117._20_4_ = auVar21._20_4_ + auVar109._20_4_;
                    auVar117._24_4_ = auVar21._24_4_ + auVar109._24_4_;
                    auVar117._28_4_ = fVar152 + auVar109._28_4_;
                    auVar21 = vsubps_avx(auVar25,auVar120);
                    auVar95._0_4_ = auVar25._0_4_ + auVar120._0_4_;
                    auVar95._4_4_ = auVar25._4_4_ + auVar120._4_4_;
                    auVar95._8_4_ = auVar25._8_4_ + auVar120._8_4_;
                    auVar95._12_4_ = auVar25._12_4_ + auVar120._12_4_;
                    auVar95._16_4_ = auVar25._16_4_ + auVar120._16_4_;
                    auVar95._20_4_ = auVar25._20_4_ + auVar120._20_4_;
                    auVar95._24_4_ = auVar25._24_4_ + auVar120._24_4_;
                    auVar95._28_4_ = fVar149 + auVar120._28_4_;
                    auVar39._4_4_ = auVar21._4_4_ * auVar117._4_4_;
                    auVar39._0_4_ = auVar21._0_4_ * auVar117._0_4_;
                    auVar39._8_4_ = auVar21._8_4_ * auVar117._8_4_;
                    auVar39._12_4_ = auVar21._12_4_ * auVar117._12_4_;
                    auVar39._16_4_ = auVar21._16_4_ * auVar117._16_4_;
                    auVar39._20_4_ = auVar21._20_4_ * auVar117._20_4_;
                    auVar39._24_4_ = auVar21._24_4_ * auVar117._24_4_;
                    auVar39._28_4_ = fVar152;
                    auVar112 = vfmsub231ps_fma(auVar39,auVar24,auVar95);
                    auVar40._4_4_ = auVar95._4_4_ * auVar22._4_4_;
                    auVar40._0_4_ = auVar95._0_4_ * auVar22._0_4_;
                    auVar40._8_4_ = auVar95._8_4_ * auVar22._8_4_;
                    auVar40._12_4_ = auVar95._12_4_ * auVar22._12_4_;
                    auVar40._16_4_ = auVar95._16_4_ * auVar22._16_4_;
                    auVar40._20_4_ = auVar95._20_4_ * auVar22._20_4_;
                    auVar40._24_4_ = auVar95._24_4_ * auVar22._24_4_;
                    auVar40._28_4_ = auVar95._28_4_;
                    auVar20 = vfmsub231ps_fma(auVar40,auVar21,auVar126);
                    auVar41._4_4_ = auVar24._4_4_ * auVar126._4_4_;
                    auVar41._0_4_ = auVar24._0_4_ * auVar126._0_4_;
                    auVar41._8_4_ = auVar24._8_4_ * auVar126._8_4_;
                    auVar41._12_4_ = auVar24._12_4_ * auVar126._12_4_;
                    auVar41._16_4_ = auVar24._16_4_ * auVar126._16_4_;
                    auVar41._20_4_ = auVar24._20_4_ * auVar126._20_4_;
                    auVar41._24_4_ = auVar24._24_4_ * auVar126._24_4_;
                    auVar41._28_4_ = auVar126._28_4_;
                    auVar113 = vfmsub231ps_fma(auVar41,auVar22,auVar117);
                    fStack_243c = local_2440;
                    fStack_2438 = local_2440;
                    fStack_2434 = local_2440;
                    fStack_2430 = local_2440;
                    fStack_242c = local_2440;
                    fStack_2428 = local_2440;
                    fStack_2424 = local_2440;
                    auVar127._0_4_ = local_2440 * auVar113._0_4_;
                    auVar127._4_4_ = local_2440 * auVar113._4_4_;
                    auVar127._8_4_ = local_2440 * auVar113._8_4_;
                    auVar127._12_4_ = local_2440 * auVar113._12_4_;
                    auVar127._16_4_ = local_2440 * 0.0;
                    auVar127._20_4_ = local_2440 * 0.0;
                    auVar127._24_4_ = local_2440 * 0.0;
                    auVar127._28_4_ = 0;
                    auVar20 = vfmadd231ps_fma(auVar127,local_2980,ZEXT1632(auVar20));
                    auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),local_29a0,ZEXT1632(auVar112));
                    auVar93._0_4_ = auVar20._0_4_ + auVar99._0_4_ + auVar111._0_4_;
                    auVar93._4_4_ = auVar20._4_4_ + auVar99._4_4_ + auVar111._4_4_;
                    auVar93._8_4_ = auVar20._8_4_ + auVar99._8_4_ + auVar111._8_4_;
                    auVar93._12_4_ = auVar20._12_4_ + auVar99._12_4_ + auVar111._12_4_;
                    local_2660 = ZEXT1632(auVar93);
                    auVar118._8_4_ = 0x7fffffff;
                    auVar118._0_8_ = 0x7fffffff7fffffff;
                    auVar118._12_4_ = 0x7fffffff;
                    auVar118._16_4_ = 0x7fffffff;
                    auVar118._20_4_ = 0x7fffffff;
                    auVar118._24_4_ = 0x7fffffff;
                    auVar118._28_4_ = 0x7fffffff;
                    local_24c0 = ZEXT1632(auVar99);
                    auVar119 = vminps_avx(local_24c0,ZEXT1632(auVar111));
                    auVar119 = vminps_avx(auVar119,ZEXT1632(auVar20));
                    local_2500 = vandps_avx(local_2660,auVar118);
                    fVar149 = local_2500._0_4_ * 1.1920929e-07;
                    fVar152 = local_2500._4_4_ * 1.1920929e-07;
                    auVar42._4_4_ = fVar152;
                    auVar42._0_4_ = fVar149;
                    fVar153 = local_2500._8_4_ * 1.1920929e-07;
                    auVar42._8_4_ = fVar153;
                    fVar154 = local_2500._12_4_ * 1.1920929e-07;
                    auVar42._12_4_ = fVar154;
                    fVar155 = local_2500._16_4_ * 1.1920929e-07;
                    auVar42._16_4_ = fVar155;
                    auVar107._0_4_ = local_2500._20_4_ * 1.1920929e-07;
                    auVar42._20_4_ = auVar107._0_4_;
                    fVar156 = local_2500._24_4_ * 1.1920929e-07;
                    auVar42._24_4_ = fVar156;
                    auVar42._28_4_ = 0x34000000;
                    auVar159._0_8_ = CONCAT44(fVar152,fVar149) ^ 0x8000000080000000;
                    auVar159._8_4_ = -fVar153;
                    auVar159._12_4_ = -fVar154;
                    auVar159._16_4_ = -fVar155;
                    auVar159._20_4_ = -auVar107._0_4_;
                    auVar159._24_4_ = -fVar156;
                    auVar159._28_4_ = 0xb4000000;
                    auVar119 = vcmpps_avx(auVar119,auVar159,5);
                    auVar141 = ZEXT1632(auVar111);
                    auVar25 = vmaxps_avx(local_24c0,auVar141);
                    auVar109 = vmaxps_avx(auVar25,ZEXT1632(auVar20));
                    auVar109 = vcmpps_avx(auVar109,auVar42,2);
                    local_24e0 = vorps_avx(auVar119,auVar109);
                    auVar120 = local_26c0 & local_24e0;
                    if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar120 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar120 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar120 >> 0x7f,0) != '\0') ||
                          (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar120 >> 0xbf,0) != '\0') ||
                        (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar120[0x1f] < '\0') {
                      auVar43._4_4_ = local_2400._4_4_ * fVar165;
                      auVar43._0_4_ = local_2400._0_4_ * fVar162;
                      auVar43._8_4_ = local_2400._8_4_ * fVar166;
                      auVar43._12_4_ = local_2400._12_4_ * fVar167;
                      auVar43._16_4_ = local_2400._16_4_ * fVar168;
                      auVar43._20_4_ = local_2400._20_4_ * fVar169;
                      auVar43._24_4_ = local_2400._24_4_ * fVar170;
                      auVar43._28_4_ = auVar109._28_4_;
                      auVar44._4_4_ = local_2420._4_4_ * fVar190;
                      auVar44._0_4_ = local_2420._0_4_ * fVar188;
                      auVar44._8_4_ = local_2420._8_4_ * fVar191;
                      auVar44._12_4_ = local_2420._12_4_ * fVar192;
                      auVar44._16_4_ = local_2420._16_4_ * fVar193;
                      auVar44._20_4_ = local_2420._20_4_ * fVar194;
                      auVar44._24_4_ = local_2420._24_4_ * fVar195;
                      auVar44._28_4_ = auVar119._28_4_;
                      auVar99 = vfmsub213ps_fma(local_2420,local_2480,auVar43);
                      auVar45._4_4_ = auVar24._4_4_ * fVar88;
                      auVar45._0_4_ = auVar24._0_4_ * fVar87;
                      auVar45._8_4_ = auVar24._8_4_ * fVar89;
                      auVar45._12_4_ = auVar24._12_4_ * fVar98;
                      auVar45._16_4_ = auVar24._16_4_ * auVar114._0_4_;
                      auVar45._20_4_ = auVar24._20_4_ * fVar104;
                      auVar45._24_4_ = auVar24._24_4_ * fVar105;
                      auVar45._28_4_ = 0x34000000;
                      auVar46._4_4_ = auVar21._4_4_ * fVar190;
                      auVar46._0_4_ = auVar21._0_4_ * fVar188;
                      auVar46._8_4_ = auVar21._8_4_ * fVar191;
                      auVar46._12_4_ = auVar21._12_4_ * fVar192;
                      auVar46._16_4_ = auVar21._16_4_ * fVar193;
                      auVar46._20_4_ = auVar21._20_4_ * fVar194;
                      auVar46._24_4_ = auVar21._24_4_ * fVar195;
                      auVar46._28_4_ = auVar25._28_4_;
                      auVar111 = vfmsub213ps_fma(auVar21,local_2460,auVar45);
                      auVar119 = vandps_avx(auVar43,auVar118);
                      auVar109 = vandps_avx(auVar45,auVar118);
                      auVar119 = vcmpps_avx(auVar119,auVar109,1);
                      auVar25 = vblendvps_avx(ZEXT1632(auVar111),ZEXT1632(auVar99),auVar119);
                      auVar47._4_4_ = fVar165 * auVar22._4_4_;
                      auVar47._0_4_ = fVar162 * auVar22._0_4_;
                      auVar47._8_4_ = fVar166 * auVar22._8_4_;
                      auVar47._12_4_ = fVar167 * auVar22._12_4_;
                      auVar47._16_4_ = fVar168 * auVar22._16_4_;
                      auVar47._20_4_ = fVar169 * auVar22._20_4_;
                      auVar47._24_4_ = fVar170 * auVar22._24_4_;
                      auVar47._28_4_ = auVar109._28_4_;
                      auVar99 = vfmsub213ps_fma(auVar22,local_2480,auVar46);
                      auVar48._4_4_ = local_23e0._4_4_ * fVar88;
                      auVar48._0_4_ = local_23e0._0_4_ * fVar87;
                      auVar48._8_4_ = local_23e0._8_4_ * fVar89;
                      auVar48._12_4_ = local_23e0._12_4_ * fVar98;
                      auVar48._16_4_ = local_23e0._16_4_ * auVar114._0_4_;
                      auVar48._20_4_ = local_23e0._20_4_ * fVar104;
                      auVar48._24_4_ = local_23e0._24_4_ * fVar105;
                      auVar48._28_4_ = local_2480._28_4_;
                      auVar111 = vfmsub213ps_fma(local_2400,local_24a0,auVar48);
                      auVar119 = vandps_avx(auVar48,auVar118);
                      auVar109 = vandps_avx(auVar46,auVar118);
                      auVar119 = vcmpps_avx(auVar119,auVar109,1);
                      auVar21 = vblendvps_avx(ZEXT1632(auVar99),ZEXT1632(auVar111),auVar119);
                      auVar99 = vfmsub213ps_fma(local_23e0,local_2460,auVar44);
                      auVar111 = vfmsub213ps_fma(auVar24,local_24a0,auVar47);
                      auVar119 = vandps_avx(auVar44,auVar118);
                      auVar109 = vandps_avx(auVar47,auVar118);
                      auVar119 = vcmpps_avx(auVar119,auVar109,1);
                      auVar24 = vblendvps_avx(ZEXT1632(auVar111),ZEXT1632(auVar99),auVar119);
                      fVar98 = auVar24._0_4_;
                      auVar114._0_4_ = auVar24._4_4_;
                      auVar49._4_4_ = auVar114._0_4_ * local_2440;
                      auVar49._0_4_ = fVar98 * local_2440;
                      fVar104 = auVar24._8_4_;
                      auVar49._8_4_ = fVar104 * local_2440;
                      fVar105 = auVar24._12_4_;
                      auVar49._12_4_ = fVar105 * local_2440;
                      fVar152 = auVar24._16_4_;
                      auVar49._16_4_ = fVar152 * local_2440;
                      fVar153 = auVar24._20_4_;
                      auVar49._20_4_ = fVar153 * local_2440;
                      fVar154 = auVar24._24_4_;
                      auVar49._24_4_ = fVar154 * local_2440;
                      auVar49._28_4_ = auVar119._28_4_;
                      auVar99 = vfmadd213ps_fma(local_2980,auVar21,auVar49);
                      auVar99 = vfmadd213ps_fma(local_29a0,auVar25,ZEXT1632(auVar99));
                      fVar149 = auVar99._0_4_ + auVar99._0_4_;
                      fVar87 = auVar99._4_4_ + auVar99._4_4_;
                      fVar88 = auVar99._8_4_ + auVar99._8_4_;
                      fVar89 = auVar99._12_4_ + auVar99._12_4_;
                      auVar120 = ZEXT1632(CONCAT412(fVar89,CONCAT48(fVar88,CONCAT44(fVar87,fVar149))
                                                   ));
                      auVar50._4_4_ = auVar114._0_4_ * fVar177;
                      auVar50._0_4_ = fVar98 * fVar171;
                      auVar50._8_4_ = fVar104 * fVar178;
                      auVar50._12_4_ = fVar105 * fVar179;
                      auVar50._16_4_ = fVar152 * fVar180;
                      auVar50._20_4_ = fVar153 * fVar181;
                      auVar50._24_4_ = fVar154 * fVar182;
                      auVar50._28_4_ = auVar109._28_4_;
                      auVar99 = vfmadd213ps_fma(local_27a0,auVar21,auVar50);
                      auVar111 = vfmadd213ps_fma(local_2780,auVar25,ZEXT1632(auVar99));
                      auVar119 = vrcpps_avx(auVar120);
                      auVar160._8_4_ = 0x3f800000;
                      auVar160._0_8_ = 0x3f8000003f800000;
                      auVar160._12_4_ = 0x3f800000;
                      auVar160._16_4_ = 0x3f800000;
                      auVar160._20_4_ = 0x3f800000;
                      auVar160._24_4_ = 0x3f800000;
                      auVar160._28_4_ = 0x3f800000;
                      auVar99 = vfnmadd213ps_fma(auVar119,auVar120,auVar160);
                      auVar99 = vfmadd132ps_fma(ZEXT1632(auVar99),auVar119,auVar119);
                      uVar90 = *(undefined4 *)((long)&(local_2950->super_RayK<1>).org.field_0 + 0xc)
                      ;
                      auVar145._4_4_ = uVar90;
                      auVar145._0_4_ = uVar90;
                      auVar145._8_4_ = uVar90;
                      auVar145._12_4_ = uVar90;
                      auVar145._16_4_ = uVar90;
                      auVar145._20_4_ = uVar90;
                      auVar145._24_4_ = uVar90;
                      auVar145._28_4_ = uVar90;
                      local_25c0 = ZEXT1632(CONCAT412(auVar99._12_4_ *
                                                      (auVar111._12_4_ + auVar111._12_4_),
                                                      CONCAT48(auVar99._8_4_ *
                                                               (auVar111._8_4_ + auVar111._8_4_),
                                                               CONCAT44(auVar99._4_4_ *
                                                                        (auVar111._4_4_ +
                                                                        auVar111._4_4_),
                                                                        auVar99._0_4_ *
                                                                        (auVar111._0_4_ +
                                                                        auVar111._0_4_)))));
                      auVar129 = ZEXT3264(local_25c0);
                      auVar119 = vcmpps_avx(auVar145,local_25c0,2);
                      auVar146._4_4_ = fVar142;
                      auVar146._0_4_ = fVar142;
                      auVar146._8_4_ = fVar142;
                      auVar146._12_4_ = fVar142;
                      auVar146._16_4_ = fVar142;
                      auVar146._20_4_ = fVar142;
                      auVar146._24_4_ = fVar142;
                      auVar146._28_4_ = fVar142;
                      auVar109 = vcmpps_avx(local_25c0,auVar146,2);
                      auVar119 = vandps_avx(auVar109,auVar119);
                      auVar147._0_8_ = CONCAT44(fVar87,fVar149) ^ 0x8000000080000000;
                      auVar147._8_4_ = -fVar88;
                      auVar147._12_4_ = -fVar89;
                      auVar147._16_4_ = 0x80000000;
                      auVar147._20_4_ = 0x80000000;
                      auVar147._24_4_ = 0x80000000;
                      auVar147._28_4_ = 0x80000000;
                      auVar109 = vcmpps_avx(auVar147,auVar120,4);
                      auVar119 = vandps_avx(auVar109,auVar119);
                      auVar109 = vandps_avx(local_24e0,local_26c0);
                      auVar119 = vpslld_avx2(auVar119,0x1f);
                      auVar120 = vpsrad_avx2(auVar119,0x1f);
                      auVar119 = auVar109 & auVar120;
                      if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar119 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar119 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar119 >> 0x7f,0) != '\0') ||
                            (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar119 >> 0xbf,0) != '\0') ||
                          (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar119[0x1f] < '\0') {
                        auVar119 = vandps_avx(auVar120,auVar109);
                        uVar54 = vextractps_avx(SUB3216(*(undefined1 (*) [32])
                                                         ((long)&(local_2950->super_RayK<1>).org.
                                                                 field_0 + 0xc),0x10),2);
                        local_2640 = &local_2a01;
                        local_2620 = auVar119;
                        auVar109 = vsubps_avx(local_2660,auVar141);
                        auVar109 = vblendvps_avx(local_24c0,auVar109,local_2520);
                        auVar120 = vsubps_avx(local_2660,local_24c0);
                        local_2680 = vblendvps_avx(auVar141,auVar120,local_2520);
                        local_25a0[0] = (float)local_2540._0_4_ * auVar25._0_4_;
                        local_25a0[1] = (float)local_2540._4_4_ * auVar25._4_4_;
                        local_25a0[2] = fStack_2538 * auVar25._8_4_;
                        local_25a0[3] = fStack_2534 * auVar25._12_4_;
                        fStack_2590 = fStack_2530 * auVar25._16_4_;
                        fStack_258c = fStack_252c * auVar25._20_4_;
                        fStack_2588 = fStack_2528 * auVar25._24_4_;
                        uStack_2584 = auVar25._28_4_;
                        local_2580[0] = (float)local_2540._0_4_ * auVar21._0_4_;
                        local_2580[1] = (float)local_2540._4_4_ * auVar21._4_4_;
                        local_2580[2] = fStack_2538 * auVar21._8_4_;
                        local_2580[3] = fStack_2534 * auVar21._12_4_;
                        fStack_2570 = fStack_2530 * auVar21._16_4_;
                        fStack_256c = fStack_252c * auVar21._20_4_;
                        fStack_2568 = fStack_2528 * auVar21._24_4_;
                        uStack_2564 = auVar25._28_4_;
                        local_2560[0] = (float)local_2540._0_4_ * fVar98;
                        local_2560[1] = (float)local_2540._4_4_ * auVar114._0_4_;
                        local_2560[2] = fStack_2538 * fVar104;
                        local_2560[3] = fStack_2534 * fVar105;
                        fStack_2550 = fStack_2530 * fVar152;
                        fStack_254c = fStack_252c * fVar153;
                        fStack_2548 = fStack_2528 * fVar154;
                        uStack_2544 = auVar24._28_4_;
                        auVar103._0_8_ = (ulong)CONCAT24(uVar11,(uint)uVar11) & 0x7fff00007fff;
                        auVar103._8_4_ = local_29b8;
                        auVar103._12_4_ = local_29b8;
                        auVar103._16_4_ = local_29b8;
                        auVar103._20_4_ = local_29b8;
                        auVar103._24_4_ = local_29b8;
                        auVar103._28_4_ = local_29b8;
                        auVar123._0_4_ = (float)(int)(*(ushort *)(local_2938 + 8 + local_2940) - 1);
                        auVar123._4_12_ = auVar93._4_12_;
                        auVar25 = vpaddd_avx2(auVar103,_DAT_01fec4a0);
                        auVar99 = vrcpss_avx(auVar123,auVar123);
                        auVar111 = vfnmadd213ss_fma(auVar99,auVar123,ZEXT416(0x40000000));
                        fStack_2688 = auVar99._0_4_ * auVar111._0_4_;
                        auVar25 = vcvtdq2ps_avx(auVar25);
                        fStack_2684 = auVar25._28_4_ + auVar109._28_4_;
                        local_26a0._0_4_ =
                             (auVar93._0_4_ * auVar25._0_4_ + auVar109._0_4_) * fStack_2688;
                        local_26a0._4_4_ =
                             (auVar93._4_4_ * auVar25._4_4_ + auVar109._4_4_) * fStack_2688;
                        fStack_2698 = (auVar93._8_4_ * auVar25._8_4_ + auVar109._8_4_) * fStack_2688
                        ;
                        fStack_2694 = (auVar93._12_4_ * auVar25._12_4_ + auVar109._12_4_) *
                                      fStack_2688;
                        fStack_2690 = (auVar25._16_4_ * 0.0 + auVar109._16_4_) * fStack_2688;
                        fStack_268c = (auVar25._20_4_ * 0.0 + auVar109._20_4_) * fStack_2688;
                        fStack_2688 = (auVar25._24_4_ * 0.0 + auVar109._24_4_) * fStack_2688;
                        pGVar14 = (local_2930->geometries).items[uVar61].ptr;
                        if ((pGVar14->mask & uVar54) != 0) {
                          auVar121._0_8_ = (ulong)CONCAT24(uVar12,(uint)uVar12) & 0x7fff00007fff;
                          auVar121._8_4_ = local_29bc;
                          auVar121._12_4_ = local_29bc;
                          auVar121._16_4_ = local_29bc;
                          auVar121._20_4_ = local_29bc;
                          auVar121._24_4_ = local_29bc;
                          auVar121._28_4_ = local_29bc;
                          auVar109 = vpaddd_avx2(auVar121,_DAT_01fec4c0);
                          auVar25 = vcvtdq2ps_avx(auVar109);
                          auVar124._0_4_ =
                               (float)(int)(*(ushort *)(local_2938 + 10 + local_2940) - 1);
                          auVar124._4_12_ = auVar93._4_12_;
                          auVar99 = vrcpss_avx(auVar124,auVar124);
                          auVar111 = vfnmadd213ss_fma(auVar99,auVar124,ZEXT416(0x40000000));
                          fVar142 = auVar99._0_4_ * auVar111._0_4_;
                          local_2760 = auVar119;
                          auVar109 = vrcpps_avx(local_2660);
                          auVar128._8_4_ = 0x3f800000;
                          auVar128._0_8_ = 0x3f8000003f800000;
                          auVar128._12_4_ = 0x3f800000;
                          auVar128._16_4_ = 0x3f800000;
                          auVar128._20_4_ = 0x3f800000;
                          auVar128._24_4_ = 0x3f800000;
                          auVar128._28_4_ = 0x3f800000;
                          auVar99 = vfnmadd213ps_fma(local_2660,auVar109,auVar128);
                          auVar99 = vfmadd132ps_fma(ZEXT1632(auVar99),auVar109,auVar109);
                          auVar122._8_4_ = 0x219392ef;
                          auVar122._0_8_ = 0x219392ef219392ef;
                          auVar122._12_4_ = 0x219392ef;
                          auVar122._16_4_ = 0x219392ef;
                          auVar122._20_4_ = 0x219392ef;
                          auVar122._24_4_ = 0x219392ef;
                          auVar122._28_4_ = 0x219392ef;
                          auVar109 = vcmpps_avx(local_2500,auVar122,5);
                          auVar109 = vandps_avx(auVar109,ZEXT1632(auVar99));
                          auVar51._4_4_ = (float)local_26a0._4_4_ * auVar109._4_4_;
                          auVar51._0_4_ = (float)local_26a0._0_4_ * auVar109._0_4_;
                          auVar51._8_4_ = fStack_2698 * auVar109._8_4_;
                          auVar51._12_4_ = fStack_2694 * auVar109._12_4_;
                          auVar51._16_4_ = fStack_2690 * auVar109._16_4_;
                          auVar51._20_4_ = fStack_268c * auVar109._20_4_;
                          auVar51._24_4_ = fStack_2688 * auVar109._24_4_;
                          auVar51._28_4_ = fStack_2684;
                          local_2600 = vminps_avx(auVar51,auVar128);
                          auVar52._4_4_ =
                               (auVar93._4_4_ * auVar25._4_4_ + local_2680._4_4_) * fVar142 *
                               auVar109._4_4_;
                          auVar52._0_4_ =
                               (auVar93._0_4_ * auVar25._0_4_ + local_2680._0_4_) * fVar142 *
                               auVar109._0_4_;
                          auVar52._8_4_ =
                               (auVar93._8_4_ * auVar25._8_4_ + local_2680._8_4_) * fVar142 *
                               auVar109._8_4_;
                          auVar52._12_4_ =
                               (auVar93._12_4_ * auVar25._12_4_ + local_2680._12_4_) * fVar142 *
                               auVar109._12_4_;
                          auVar52._16_4_ =
                               (auVar25._16_4_ * 0.0 + local_2680._16_4_) * fVar142 *
                               auVar109._16_4_;
                          auVar52._20_4_ =
                               (auVar25._20_4_ * 0.0 + local_2680._20_4_) * fVar142 *
                               auVar109._20_4_;
                          auVar52._24_4_ =
                               (auVar25._24_4_ * 0.0 + local_2680._24_4_) * fVar142 *
                               auVar109._24_4_;
                          auVar52._28_4_ = auVar109._28_4_;
                          local_25e0 = vminps_avx(auVar52,auVar128);
                          auVar96._8_4_ = 0x7f800000;
                          auVar96._0_8_ = 0x7f8000007f800000;
                          auVar96._12_4_ = 0x7f800000;
                          auVar96._16_4_ = 0x7f800000;
                          auVar96._20_4_ = 0x7f800000;
                          auVar96._24_4_ = 0x7f800000;
                          auVar96._28_4_ = 0x7f800000;
                          auVar109 = vblendvps_avx(auVar96,local_25c0,auVar119);
                          auVar25 = vshufps_avx(auVar109,auVar109,0xb1);
                          auVar25 = vminps_avx(auVar109,auVar25);
                          auVar24 = vshufpd_avx(auVar25,auVar25,5);
                          auVar25 = vminps_avx(auVar25,auVar24);
                          auVar24 = vpermpd_avx2(auVar25,0x4e);
                          auVar25 = vminps_avx(auVar25,auVar24);
                          auVar109 = vcmpps_avx(auVar109,auVar25,0);
                          auVar25 = auVar119 & auVar109;
                          if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar25 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || SUB321(auVar25 >> 0x7f,0) != '\0') ||
                                (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar25 >> 0xbf,0) != '\0') ||
                              (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                              auVar25[0x1f] < '\0') {
                            auVar119 = vandps_avx(auVar109,auVar119);
                          }
                          uVar55 = vmovmskps_avx(auVar119);
                          uVar54 = 0;
                          for (; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x80000000) {
                            uVar54 = uVar54 + 1;
                          }
                          uVar65 = (ulong)uVar54;
                          pRVar18 = local_29c8->args;
                          if ((pRVar18->filter != (RTCFilterFunctionN)0x0) ||
                             (pGVar14->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                            local_2980 = ZEXT432((uint)(local_2950->super_RayK<1>).tfar);
                            pRVar19 = local_29c8->user;
                            local_29a0 = local_25c0;
                            do {
                              local_28e4 = *(undefined4 *)(local_2600 + uVar65 * 4);
                              local_28e0 = *(undefined4 *)(local_25e0 + uVar65 * 4);
                              (pRVar53->super_RayK<1>).tfar = local_25a0[uVar65 - 8];
                              local_28f0 = local_25a0[uVar65];
                              local_28ec = local_2580[uVar65];
                              local_28e8 = local_2560[uVar65];
                              local_28dc = (int)local_29a8;
                              local_28d8 = uVar61;
                              local_28d4 = pRVar19->instID[0];
                              local_28d0 = pRVar19->instPrimID[0];
                              local_29b4 = -1;
                              local_2920.valid = &local_29b4;
                              local_2920.geometryUserPtr = pGVar14->userPtr;
                              local_2920.context = pRVar19;
                              local_2920.ray = (RTCRayN *)pRVar53;
                              local_2920.hit = (RTCHitN *)&local_28f0;
                              local_2920.N = 1;
                              if (pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_019bbd80:
                                if ((pRVar18->filter != (RTCFilterFunctionN)0x0) &&
                                   (((pRVar18->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*pRVar18->filter)(&local_2920);
                                  auVar129 = ZEXT3264(local_29a0);
                                  if (*local_2920.valid == 0) goto LAB_019bbe16;
                                }
                                (((Vec3f *)((long)local_2920.ray + 0x30))->field_0).field_0.x =
                                     *(float *)local_2920.hit;
                                (((Vec3f *)((long)local_2920.ray + 0x30))->field_0).field_0.y =
                                     *(float *)(local_2920.hit + 4);
                                (((Vec3f *)((long)local_2920.ray + 0x30))->field_0).field_0.z =
                                     *(float *)(local_2920.hit + 8);
                                *(float *)((long)local_2920.ray + 0x3c) =
                                     *(float *)(local_2920.hit + 0xc);
                                *(float *)((long)local_2920.ray + 0x40) =
                                     *(float *)(local_2920.hit + 0x10);
                                *(float *)((long)local_2920.ray + 0x44) =
                                     *(float *)(local_2920.hit + 0x14);
                                *(float *)((long)local_2920.ray + 0x48) =
                                     *(float *)(local_2920.hit + 0x18);
                                *(float *)((long)local_2920.ray + 0x4c) =
                                     *(float *)(local_2920.hit + 0x1c);
                                *(float *)((long)local_2920.ray + 0x50) =
                                     *(float *)(local_2920.hit + 0x20);
                              }
                              else {
                                (*pGVar14->intersectionFilterN)(&local_2920);
                                auVar129 = ZEXT3264(local_29a0);
                                if (*local_2920.valid != 0) goto LAB_019bbd80;
LAB_019bbe16:
                                (pRVar53->super_RayK<1>).tfar = (float)local_2980._0_4_;
                              }
                              *(undefined4 *)(local_2760 + uVar65 * 4) = 0;
                              auVar25 = local_2760;
                              fVar142 = (pRVar53->super_RayK<1>).tfar;
                              auVar85._4_4_ = fVar142;
                              auVar85._0_4_ = fVar142;
                              auVar85._8_4_ = fVar142;
                              auVar85._12_4_ = fVar142;
                              auVar85._16_4_ = fVar142;
                              auVar85._20_4_ = fVar142;
                              auVar85._24_4_ = fVar142;
                              auVar85._28_4_ = fVar142;
                              auVar109 = vcmpps_avx(auVar129._0_32_,auVar85,2);
                              auVar119 = vandps_avx(auVar109,local_2760);
                              local_2760 = auVar119;
                              auVar25 = auVar25 & auVar109;
                              if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar25 >> 0x3f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar25 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar25 >> 0x7f,0) == '\0')
                                    && (auVar25 & (undefined1  [32])0x100000000) ==
                                       (undefined1  [32])0x0) && SUB321(auVar25 >> 0xbf,0) == '\0')
                                  && (auVar25 & (undefined1  [32])0x100000000) ==
                                     (undefined1  [32])0x0) && -1 < auVar25[0x1f])
                              goto LAB_019bbbe3;
                              auVar97._8_4_ = 0x7f800000;
                              auVar97._0_8_ = 0x7f8000007f800000;
                              auVar97._12_4_ = 0x7f800000;
                              auVar97._16_4_ = 0x7f800000;
                              auVar97._20_4_ = 0x7f800000;
                              auVar97._24_4_ = 0x7f800000;
                              auVar97._28_4_ = 0x7f800000;
                              auVar109 = vblendvps_avx(auVar97,auVar129._0_32_,auVar119);
                              auVar25 = vshufps_avx(auVar109,auVar109,0xb1);
                              auVar25 = vminps_avx(auVar109,auVar25);
                              auVar24 = vshufpd_avx(auVar25,auVar25,5);
                              auVar25 = vminps_avx(auVar25,auVar24);
                              auVar24 = vpermpd_avx2(auVar25,0x4e);
                              auVar25 = vminps_avx(auVar25,auVar24);
                              auVar109 = vcmpps_avx(auVar109,auVar25,0);
                              auVar25 = auVar119 & auVar109;
                              local_2980 = *(undefined1 (*) [32])&(pRVar53->super_RayK<1>).tfar;
                              if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0 ||
                                       (auVar25 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar25 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar25 >> 0x7f,0) != '\0')
                                    || (auVar25 & (undefined1  [32])0x100000000) !=
                                       (undefined1  [32])0x0) || SUB321(auVar25 >> 0xbf,0) != '\0')
                                  || (auVar25 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0) || auVar25[0x1f] < '\0') {
                                auVar119 = vandps_avx(auVar109,auVar119);
                              }
                              uVar54 = vmovmskps_avx(auVar119);
                              uVar13 = 0;
                              for (; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x80000000) {
                                uVar13 = uVar13 + 1;
                              }
                              uVar65 = (ulong)uVar13;
                            } while( true );
                          }
                          fVar142 = *(float *)(local_2600 + uVar65 * 4);
                          fVar149 = *(float *)(local_25e0 + uVar65 * 4);
                          fVar87 = local_25a0[uVar65];
                          fVar88 = local_2580[uVar65];
                          fVar89 = local_2560[uVar65];
                          (local_2950->super_RayK<1>).tfar = local_25a0[uVar65 - 8];
                          (local_2950->Ng).field_0.field_0.x = fVar87;
                          (local_2950->Ng).field_0.field_0.y = fVar88;
                          (local_2950->Ng).field_0.field_0.z = fVar89;
                          local_2950->u = fVar142;
                          local_2950->v = fVar149;
                          local_2950->primID = uVar13;
                          local_2950->geomID = uVar61;
                          pRVar19 = local_29c8->user;
                          local_2950->instID[0] = pRVar19->instID[0];
                          local_2950->instPrimID[0] = pRVar19->instPrimID[0];
                        }
                      }
                    }
LAB_019bbbe3:
                    auVar176 = ZEXT3264(local_2800);
                    auVar187 = ZEXT3264(local_2820);
                    auVar189 = ZEXT3264(local_2840);
                    auVar161 = ZEXT3264(local_2860);
                    auVar186 = ZEXT3264(local_2880);
                    pauVar56 = local_2a00;
                    uVar65 = local_29e8;
                    uVar69 = local_2948;
                    uVar68 = local_29d0;
                    uVar70 = local_29d8;
                    uVar71 = local_29e0;
                    context = local_29c8;
                    ray = pRVar53;
                    uVar74 = local_29f0;
                    uVar76 = local_29f8;
                  }
                  local_2928 = local_2928 - 1 & local_2928;
                } while (local_2928 != 0);
              }
              local_2958 = local_2958 + 1;
            } while (local_2958 != local_2960);
          }
          fVar142 = (ray->super_RayK<1>).tfar;
          auVar164 = ZEXT3264(CONCAT428(fVar142,CONCAT424(fVar142,CONCAT420(fVar142,CONCAT416(
                                                  fVar142,CONCAT412(fVar142,CONCAT48(fVar142,
                                                  CONCAT44(fVar142,fVar142))))))));
          auVar86 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
          auVar129 = ZEXT3264(local_28a0);
          auVar134 = ZEXT3264(local_28c0);
          auVar148 = ZEXT3264(_local_2700);
          auVar114._0_4_ = local_26e0;
          fVar142 = fStack_26dc;
          fVar149 = fStack_26d8;
          fVar87 = fStack_26d4;
          fVar88 = fStack_26d0;
          fVar89 = fStack_26cc;
          fVar98 = fStack_26c8;
          auVar107._0_4_ = local_2720;
          fVar104 = fStack_271c;
          fVar105 = fStack_2718;
          fVar152 = fStack_2714;
          fVar153 = fStack_2710;
          fVar154 = fStack_270c;
          fVar155 = fStack_2708;
          break;
        }
        uVar90 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
        auVar82._4_4_ = uVar90;
        auVar82._0_4_ = uVar90;
        auVar82._8_4_ = uVar90;
        auVar82._12_4_ = uVar90;
        auVar82._16_4_ = uVar90;
        auVar82._20_4_ = uVar90;
        auVar82._24_4_ = uVar90;
        auVar82._28_4_ = uVar90;
        uVar57 = uVar69 & 0xfffffffffffffff0;
        auVar99 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar57 + 0x100 + uVar68),auVar82,
                                  *(undefined1 (*) [32])(uVar57 + 0x40 + uVar68));
        auVar119 = vsubps_avx(ZEXT1632(auVar99),auVar129._0_32_);
        auVar99 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar57 + 0x100 + uVar70),auVar82,
                                  *(undefined1 (*) [32])(uVar57 + 0x40 + uVar70));
        auVar26._4_4_ = fVar142 * auVar119._4_4_;
        auVar26._0_4_ = auVar114._0_4_ * auVar119._0_4_;
        auVar26._8_4_ = fVar149 * auVar119._8_4_;
        auVar26._12_4_ = fVar87 * auVar119._12_4_;
        auVar26._16_4_ = fVar88 * auVar119._16_4_;
        auVar26._20_4_ = fVar89 * auVar119._20_4_;
        auVar26._24_4_ = fVar98 * auVar119._24_4_;
        auVar26._28_4_ = auVar119._28_4_;
        auVar119 = vsubps_avx(ZEXT1632(auVar99),auVar134._0_32_);
        auVar27._4_4_ = auVar148._4_4_ * auVar119._4_4_;
        auVar27._0_4_ = auVar148._0_4_ * auVar119._0_4_;
        auVar27._8_4_ = auVar148._8_4_ * auVar119._8_4_;
        auVar27._12_4_ = auVar148._12_4_ * auVar119._12_4_;
        auVar27._16_4_ = auVar148._16_4_ * auVar119._16_4_;
        auVar27._20_4_ = auVar148._20_4_ * auVar119._20_4_;
        auVar27._24_4_ = auVar148._24_4_ * auVar119._24_4_;
        auVar27._28_4_ = auVar119._28_4_;
        auVar99 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar57 + 0x100 + uVar71),auVar82,
                                  *(undefined1 (*) [32])(uVar57 + 0x40 + uVar71));
        auVar119 = vsubps_avx(ZEXT1632(auVar99),auVar186._0_32_);
        auVar28._4_4_ = auVar176._4_4_ * auVar119._4_4_;
        auVar28._0_4_ = auVar176._0_4_ * auVar119._0_4_;
        auVar28._8_4_ = auVar176._8_4_ * auVar119._8_4_;
        auVar28._12_4_ = auVar176._12_4_ * auVar119._12_4_;
        auVar28._16_4_ = auVar176._16_4_ * auVar119._16_4_;
        auVar28._20_4_ = auVar176._20_4_ * auVar119._20_4_;
        auVar28._24_4_ = auVar176._24_4_ * auVar119._24_4_;
        auVar28._28_4_ = auVar119._28_4_;
        auVar119 = vmaxps_avx(auVar27,auVar28);
        auVar109 = vmaxps_avx(auVar161._0_32_,auVar26);
        _local_26a0 = vmaxps_avx(auVar109,auVar119);
        auVar99 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar57 + 0x100 + uVar65),auVar82,
                                  *(undefined1 (*) [32])(uVar57 + 0x40 + uVar65));
        auVar119 = vsubps_avx(ZEXT1632(auVar99),auVar129._0_32_);
        auVar29._4_4_ = fVar104 * auVar119._4_4_;
        auVar29._0_4_ = auVar107._0_4_ * auVar119._0_4_;
        auVar29._8_4_ = fVar105 * auVar119._8_4_;
        auVar29._12_4_ = fVar152 * auVar119._12_4_;
        auVar29._16_4_ = fVar153 * auVar119._16_4_;
        auVar29._20_4_ = fVar154 * auVar119._20_4_;
        auVar29._24_4_ = fVar155 * auVar119._24_4_;
        auVar29._28_4_ = auVar119._28_4_;
        auVar99 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar57 + 0x100 + uVar74),auVar82,
                                  *(undefined1 (*) [32])(uVar57 + 0x40 + uVar74));
        auVar119 = vsubps_avx(ZEXT1632(auVar99),auVar134._0_32_);
        auVar30._4_4_ = auVar187._4_4_ * auVar119._4_4_;
        auVar30._0_4_ = auVar187._0_4_ * auVar119._0_4_;
        auVar30._8_4_ = auVar187._8_4_ * auVar119._8_4_;
        auVar30._12_4_ = auVar187._12_4_ * auVar119._12_4_;
        auVar30._16_4_ = auVar187._16_4_ * auVar119._16_4_;
        auVar30._20_4_ = auVar187._20_4_ * auVar119._20_4_;
        auVar30._24_4_ = auVar187._24_4_ * auVar119._24_4_;
        auVar30._28_4_ = auVar119._28_4_;
        auVar99 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar57 + 0x100 + uVar76),auVar82,
                                  *(undefined1 (*) [32])(uVar57 + 0x40 + uVar76));
        auVar119 = vsubps_avx(ZEXT1632(auVar99),auVar186._0_32_);
        auVar31._4_4_ = auVar189._4_4_ * auVar119._4_4_;
        auVar31._0_4_ = auVar189._0_4_ * auVar119._0_4_;
        auVar31._8_4_ = auVar189._8_4_ * auVar119._8_4_;
        auVar31._12_4_ = auVar189._12_4_ * auVar119._12_4_;
        auVar31._16_4_ = auVar189._16_4_ * auVar119._16_4_;
        auVar31._20_4_ = auVar189._20_4_ * auVar119._20_4_;
        auVar31._24_4_ = auVar189._24_4_ * auVar119._24_4_;
        auVar31._28_4_ = auVar119._28_4_;
        auVar119 = vminps_avx(auVar30,auVar31);
        auVar109 = vminps_avx(auVar164._0_32_,auVar29);
        auVar119 = vminps_avx(auVar109,auVar119);
        auVar119 = vcmpps_avx(_local_26a0,auVar119,2);
        if (((uint)uVar69 & 7) == 6) {
          auVar109 = vcmpps_avx(*(undefined1 (*) [32])(uVar57 + 0x1c0),auVar82,2);
          auVar25 = vcmpps_avx(auVar82,*(undefined1 (*) [32])(uVar57 + 0x1e0),1);
          auVar109 = vandps_avx(auVar109,auVar25);
          auVar119 = vandps_avx(auVar109,auVar119);
          auVar99 = vpackssdw_avx(auVar119._0_16_,auVar119._16_16_);
        }
        else {
          auVar99 = vpackssdw_avx(auVar119._0_16_,auVar119._16_16_);
        }
        auVar99 = vpsllw_avx(auVar99,0xf);
        if ((((((((auVar99 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar99 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar99 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar99 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar99 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar99 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar99 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar99[0xf] < '\0') goto code_r0x019bab10;
        auVar99 = vmovshdup_avx(SUB3216(*(undefined1 (*) [32])
                                         ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc),0));
        auVar86 = ZEXT1664(auVar99);
        if (pauVar56 == (undefined1 (*) [16])&local_23a0) {
          return;
        }
      }
    } while (pauVar56 != (undefined1 (*) [16])&local_23a0);
  }
  return;
code_r0x019bab10:
  auVar99 = vpacksswb_avx(auVar99,auVar99);
  bVar23 = SUB161(auVar99 >> 7,0) & 1 | (SUB161(auVar99 >> 0xf,0) & 1) << 1 |
           (SUB161(auVar99 >> 0x17,0) & 1) << 2 | (SUB161(auVar99 >> 0x1f,0) & 1) << 3 |
           (SUB161(auVar99 >> 0x27,0) & 1) << 4 | (SUB161(auVar99 >> 0x2f,0) & 1) << 5 |
           (SUB161(auVar99 >> 0x37,0) & 1) << 6 | SUB161(auVar99 >> 0x3f,0) << 7;
  lVar59 = 0;
  for (uVar69 = (ulong)bVar23; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
    lVar59 = lVar59 + 1;
  }
  uVar69 = *(ulong *)(uVar57 + lVar59 * 8);
  uVar61 = bVar23 - 1 & (uint)bVar23;
  uVar63 = (ulong)uVar61;
  if (uVar61 != 0) {
    uVar13 = *(uint *)(local_26a0 + lVar59 * 4);
    lVar59 = 0;
    for (; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
      lVar59 = lVar59 + 1;
    }
    uVar61 = uVar61 - 1 & uVar61;
    uVar62 = (ulong)uVar61;
    uVar63 = *(ulong *)(uVar57 + lVar59 * 8);
    uVar54 = *(uint *)(local_26a0 + lVar59 * 4);
    if (uVar61 != 0) {
      auVar77._8_8_ = 0;
      auVar77._0_8_ = uVar69;
      auVar99 = vpunpcklqdq_avx(auVar77,ZEXT416(uVar13));
      auVar91._8_8_ = 0;
      auVar91._0_8_ = uVar63;
      auVar111 = vpunpcklqdq_avx(auVar91,ZEXT416(uVar54));
      lVar59 = 0;
      for (; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
        lVar59 = lVar59 + 1;
      }
      uVar61 = uVar61 - 1 & uVar61;
      uVar69 = (ulong)uVar61;
      auVar100._8_8_ = 0;
      auVar100._0_8_ = *(ulong *)(uVar57 + lVar59 * 8);
      auVar20 = vpunpcklqdq_avx(auVar100,ZEXT416(*(uint *)(local_26a0 + lVar59 * 4)));
      if (uVar61 == 0) {
        auVar112 = vpcmpgtd_avx(auVar111,auVar99);
        auVar113 = vpshufd_avx(auVar112,0xaa);
        auVar112 = vblendvps_avx(auVar111,auVar99,auVar113);
        auVar99 = vblendvps_avx(auVar99,auVar111,auVar113);
        auVar111 = vpcmpgtd_avx(auVar20,auVar112);
        auVar113 = vpshufd_avx(auVar111,0xaa);
        auVar111 = vblendvps_avx(auVar20,auVar112,auVar113);
        auVar20 = vblendvps_avx(auVar112,auVar20,auVar113);
        auVar112 = vpcmpgtd_avx(auVar20,auVar99);
        auVar113 = vpshufd_avx(auVar112,0xaa);
        auVar112 = vblendvps_avx(auVar20,auVar99,auVar113);
        auVar99 = vblendvps_avx(auVar99,auVar20,auVar113);
        *pauVar56 = auVar99;
        pauVar56[1] = auVar112;
        uVar69 = auVar111._0_8_;
        pauVar56 = pauVar56 + 2;
        goto joined_r0x019baa11;
      }
      lVar59 = 0;
      for (; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
        lVar59 = lVar59 + 1;
      }
      uVar61 = uVar61 - 1 & uVar61;
      uVar63 = (ulong)uVar61;
      auVar108._8_8_ = 0;
      auVar108._0_8_ = *(ulong *)(uVar57 + lVar59 * 8);
      auVar112 = vpunpcklqdq_avx(auVar108,ZEXT416(*(uint *)(local_26a0 + lVar59 * 4)));
      uVar65 = local_29e8;
      uVar68 = local_29d0;
      uVar70 = local_29d8;
      uVar71 = local_29e0;
      uVar74 = local_29f0;
      uVar76 = local_29f8;
      if (uVar61 == 0) {
        auVar113 = vpcmpgtd_avx(auVar111,auVar99);
        auVar2 = vpshufd_avx(auVar113,0xaa);
        auVar113 = vblendvps_avx(auVar111,auVar99,auVar2);
        auVar99 = vblendvps_avx(auVar99,auVar111,auVar2);
        auVar111 = vpcmpgtd_avx(auVar112,auVar20);
        auVar2 = vpshufd_avx(auVar111,0xaa);
        auVar111 = vblendvps_avx(auVar112,auVar20,auVar2);
        auVar20 = vblendvps_avx(auVar20,auVar112,auVar2);
        auVar112 = vpcmpgtd_avx(auVar20,auVar99);
        auVar2 = vpshufd_avx(auVar112,0xaa);
        auVar112 = vblendvps_avx(auVar20,auVar99,auVar2);
        auVar99 = vblendvps_avx(auVar99,auVar20,auVar2);
        auVar20 = vpcmpgtd_avx(auVar111,auVar113);
        auVar2 = vpshufd_avx(auVar20,0xaa);
        auVar20 = vblendvps_avx(auVar111,auVar113,auVar2);
        auVar111 = vblendvps_avx(auVar113,auVar111,auVar2);
        auVar113 = vpcmpgtd_avx(auVar112,auVar111);
        auVar2 = vpshufd_avx(auVar113,0xaa);
        auVar113 = vblendvps_avx(auVar112,auVar111,auVar2);
        auVar111 = vblendvps_avx(auVar111,auVar112,auVar2);
        *pauVar56 = auVar99;
        pauVar56[1] = auVar111;
        pauVar56[2] = auVar113;
        uVar69 = auVar20._0_8_;
        pauVar58 = pauVar56 + 3;
      }
      else {
        *pauVar56 = auVar99;
        pauVar56[1] = auVar111;
        pauVar56[2] = auVar20;
        pauVar56[3] = auVar112;
        lVar59 = 0x30;
        do {
          lVar66 = lVar59;
          lVar59 = 0;
          for (uVar69 = uVar63; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
            lVar59 = lVar59 + 1;
          }
          uVar69 = *(ulong *)(uVar57 + lVar59 * 8);
          auVar78._8_8_ = 0;
          auVar78._0_8_ = uVar69;
          auVar99 = vpunpcklqdq_avx(auVar78,ZEXT416(*(uint *)(local_26a0 + lVar59 * 4)));
          *(undefined1 (*) [16])(pauVar56[1] + lVar66) = auVar99;
          uVar63 = uVar63 - 1 & uVar63;
          lVar59 = lVar66 + 0x10;
        } while (uVar63 != 0);
        pauVar58 = (undefined1 (*) [16])(pauVar56[1] + lVar66);
        if (lVar66 + 0x10 == 0) {
          auVar129 = ZEXT3264(local_28a0);
          auVar134 = ZEXT3264(local_28c0);
          auVar176 = ZEXT3264(local_2800);
          auVar187 = ZEXT3264(local_2820);
          auVar189 = ZEXT3264(local_2840);
          auVar161 = ZEXT3264(local_2860);
          auVar164 = ZEXT3264(local_27c0);
          auVar186 = ZEXT3264(local_2880);
          pauVar56 = pauVar58;
          goto joined_r0x019baa11;
        }
        lVar59 = 0x10;
        pauVar64 = pauVar56;
        do {
          auVar99 = pauVar64[1];
          pauVar64 = pauVar64 + 1;
          uVar61 = vextractps_avx(auVar99,2);
          lVar66 = lVar59;
          do {
            if (uVar61 <= *(uint *)(pauVar56[-1] + lVar66 + 8)) {
              pauVar67 = (undefined1 (*) [16])(*pauVar56 + lVar66);
              break;
            }
            *(undefined1 (*) [16])(*pauVar56 + lVar66) =
                 *(undefined1 (*) [16])(pauVar56[-1] + lVar66);
            lVar66 = lVar66 + -0x10;
            pauVar67 = pauVar56;
          } while (lVar66 != 0);
          *pauVar67 = auVar99;
          lVar59 = lVar59 + 0x10;
        } while (pauVar58 != pauVar64);
        uVar69 = *(ulong *)*pauVar58;
      }
      auVar129 = ZEXT3264(local_28a0);
      auVar134 = ZEXT3264(local_28c0);
      auVar176 = ZEXT3264(local_2800);
      auVar187 = ZEXT3264(local_2820);
      auVar189 = ZEXT3264(local_2840);
      auVar161 = ZEXT3264(local_2860);
      auVar164 = ZEXT3264(local_27c0);
      auVar186 = ZEXT3264(local_2880);
      pauVar56 = pauVar58;
      goto joined_r0x019baa11;
    }
    if (uVar13 < uVar54) {
      *(ulong *)*pauVar56 = uVar63;
      *(uint *)(*pauVar56 + 8) = uVar54;
      pauVar56 = pauVar56 + 1;
    }
    else {
      *(ulong *)*pauVar56 = uVar69;
      *(uint *)(*pauVar56 + 8) = uVar13;
      pauVar56 = pauVar56 + 1;
      uVar69 = uVar63;
    }
  }
  goto joined_r0x019baa11;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }